

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  Primitive PVar10;
  uint uVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [12];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  LinearSpace3fa *pLVar65;
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  byte bVar71;
  long lVar72;
  uint uVar73;
  uint uVar74;
  float fVar75;
  float fVar115;
  float fVar116;
  vint4 bi_1;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar117;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar76;
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar92 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar129 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 extraout_var [56];
  float fVar151;
  float fVar184;
  float fVar185;
  vint4 bi_2;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar186;
  float fVar201;
  float fVar202;
  vint4 ai_1;
  undefined1 auVar187 [16];
  float fVar203;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  float fVar204;
  float fVar229;
  float fVar230;
  vint4 ai_2;
  undefined1 auVar205 [16];
  float fVar231;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar232;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar233;
  float fVar250;
  float fVar251;
  undefined1 auVar234 [16];
  float fVar252;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar264 [16];
  vint4 ai;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  float fVar293;
  float fVar301;
  float fVar302;
  undefined1 auVar294 [16];
  float fVar303;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar299 [32];
  float fVar304;
  undefined1 auVar300 [32];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  float fVar315;
  float fVar325;
  float fVar327;
  undefined1 auVar317 [16];
  float fVar316;
  undefined1 auVar323 [32];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  float fVar326;
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar324 [64];
  float fVar331;
  float fVar337;
  float fVar338;
  undefined1 auVar332 [16];
  float fVar339;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar348;
  float fVar349;
  undefined1 auVar345 [16];
  float fVar350;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar351;
  vfloat4 a0;
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  float fVar359;
  float fVar363;
  float fVar364;
  undefined1 auVar360 [16];
  float fVar365;
  undefined1 auVar361 [16];
  float fVar366;
  undefined1 auVar362 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float fStack_540;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float fStack_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float fStack_500;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [16];
  undefined1 (*local_430) [16];
  LinearSpace3fa *local_428;
  Primitive *local_420;
  RTCFilterFunctionNArguments local_418;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  uint auStack_398 [4];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar263 [32];
  undefined1 auVar358 [32];
  
  PVar10 = prim[1];
  uVar68 = (ulong)(byte)PVar10;
  lVar69 = uVar68 * 0x25;
  fVar76 = *(float *)(prim + lVar69 + 0x12);
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar194 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar194 = vinsertps_avx(auVar194,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar96 = vsubps_avx(auVar96,*(undefined1 (*) [16])(prim + lVar69 + 6));
  auVar118._0_4_ = fVar76 * auVar96._0_4_;
  auVar118._4_4_ = fVar76 * auVar96._4_4_;
  auVar118._8_4_ = fVar76 * auVar96._8_4_;
  auVar118._12_4_ = fVar76 * auVar96._12_4_;
  auVar265._0_4_ = fVar76 * auVar194._0_4_;
  auVar265._4_4_ = fVar76 * auVar194._4_4_;
  auVar265._8_4_ = fVar76 * auVar194._8_4_;
  auVar265._12_4_ = fVar76 * auVar194._12_4_;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar181 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar68 + 6)));
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar167 = vshufps_avx(auVar265,auVar265,0);
  auVar132 = vshufps_avx(auVar265,auVar265,0x55);
  auVar264 = vshufps_avx(auVar265,auVar265,0xaa);
  fVar76 = auVar264._0_4_;
  fVar151 = auVar264._4_4_;
  fVar184 = auVar264._8_4_;
  fVar185 = auVar264._12_4_;
  fVar204 = auVar132._0_4_;
  fVar229 = auVar132._4_4_;
  fVar230 = auVar132._8_4_;
  fVar231 = auVar132._12_4_;
  fVar186 = auVar167._0_4_;
  fVar201 = auVar167._4_4_;
  fVar202 = auVar167._8_4_;
  fVar203 = auVar167._12_4_;
  auVar332._0_4_ = fVar186 * auVar96._0_4_ + fVar204 * auVar194._0_4_ + fVar76 * auVar181._0_4_;
  auVar332._4_4_ = fVar201 * auVar96._4_4_ + fVar229 * auVar194._4_4_ + fVar151 * auVar181._4_4_;
  auVar332._8_4_ = fVar202 * auVar96._8_4_ + fVar230 * auVar194._8_4_ + fVar184 * auVar181._8_4_;
  auVar332._12_4_ = fVar203 * auVar96._12_4_ + fVar231 * auVar194._12_4_ + fVar185 * auVar181._12_4_
  ;
  auVar345._0_4_ = fVar186 * auVar18._0_4_ + fVar204 * auVar161._0_4_ + auVar19._0_4_ * fVar76;
  auVar345._4_4_ = fVar201 * auVar18._4_4_ + fVar229 * auVar161._4_4_ + auVar19._4_4_ * fVar151;
  auVar345._8_4_ = fVar202 * auVar18._8_4_ + fVar230 * auVar161._8_4_ + auVar19._8_4_ * fVar184;
  auVar345._12_4_ = fVar203 * auVar18._12_4_ + fVar231 * auVar161._12_4_ + auVar19._12_4_ * fVar185;
  auVar266._0_4_ = fVar186 * auVar20._0_4_ + fVar204 * auVar143._0_4_ + auVar131._0_4_ * fVar76;
  auVar266._4_4_ = fVar201 * auVar20._4_4_ + fVar229 * auVar143._4_4_ + auVar131._4_4_ * fVar151;
  auVar266._8_4_ = fVar202 * auVar20._8_4_ + fVar230 * auVar143._8_4_ + auVar131._8_4_ * fVar184;
  auVar266._12_4_ = fVar203 * auVar20._12_4_ + fVar231 * auVar143._12_4_ + auVar131._12_4_ * fVar185
  ;
  auVar167 = vshufps_avx(auVar118,auVar118,0);
  auVar132 = vshufps_avx(auVar118,auVar118,0x55);
  auVar264 = vshufps_avx(auVar118,auVar118,0xaa);
  fVar76 = auVar264._0_4_;
  fVar151 = auVar264._4_4_;
  fVar184 = auVar264._8_4_;
  fVar185 = auVar264._12_4_;
  fVar204 = auVar132._0_4_;
  fVar229 = auVar132._4_4_;
  fVar230 = auVar132._8_4_;
  fVar231 = auVar132._12_4_;
  fVar186 = auVar167._0_4_;
  fVar201 = auVar167._4_4_;
  fVar202 = auVar167._8_4_;
  fVar203 = auVar167._12_4_;
  auVar119._0_4_ = fVar186 * auVar96._0_4_ + fVar204 * auVar194._0_4_ + fVar76 * auVar181._0_4_;
  auVar119._4_4_ = fVar201 * auVar96._4_4_ + fVar229 * auVar194._4_4_ + fVar151 * auVar181._4_4_;
  auVar119._8_4_ = fVar202 * auVar96._8_4_ + fVar230 * auVar194._8_4_ + fVar184 * auVar181._8_4_;
  auVar119._12_4_ = fVar203 * auVar96._12_4_ + fVar231 * auVar194._12_4_ + fVar185 * auVar181._12_4_
  ;
  auVar77._0_4_ = fVar186 * auVar18._0_4_ + auVar19._0_4_ * fVar76 + fVar204 * auVar161._0_4_;
  auVar77._4_4_ = fVar201 * auVar18._4_4_ + auVar19._4_4_ * fVar151 + fVar229 * auVar161._4_4_;
  auVar77._8_4_ = fVar202 * auVar18._8_4_ + auVar19._8_4_ * fVar184 + fVar230 * auVar161._8_4_;
  auVar77._12_4_ = fVar203 * auVar18._12_4_ + auVar19._12_4_ * fVar185 + fVar231 * auVar161._12_4_;
  auVar276._8_4_ = 0x7fffffff;
  auVar276._0_8_ = 0x7fffffff7fffffff;
  auVar276._12_4_ = 0x7fffffff;
  auVar96 = vandps_avx(auVar332,auVar276);
  auVar205._8_4_ = 0x219392ef;
  auVar205._0_8_ = 0x219392ef219392ef;
  auVar205._12_4_ = 0x219392ef;
  auVar96 = vcmpps_avx(auVar96,auVar205,1);
  auVar194 = vblendvps_avx(auVar332,auVar205,auVar96);
  auVar96 = vandps_avx(auVar345,auVar276);
  auVar96 = vcmpps_avx(auVar96,auVar205,1);
  auVar181 = vblendvps_avx(auVar345,auVar205,auVar96);
  auVar96 = vandps_avx(auVar276,auVar266);
  auVar96 = vcmpps_avx(auVar96,auVar205,1);
  auVar96 = vblendvps_avx(auVar266,auVar205,auVar96);
  auVar152._0_4_ = fVar186 * auVar20._0_4_ + fVar204 * auVar143._0_4_ + auVar131._0_4_ * fVar76;
  auVar152._4_4_ = fVar201 * auVar20._4_4_ + fVar229 * auVar143._4_4_ + auVar131._4_4_ * fVar151;
  auVar152._8_4_ = fVar202 * auVar20._8_4_ + fVar230 * auVar143._8_4_ + auVar131._8_4_ * fVar184;
  auVar152._12_4_ = fVar203 * auVar20._12_4_ + fVar231 * auVar143._12_4_ + auVar131._12_4_ * fVar185
  ;
  auVar18 = vrcpps_avx(auVar194);
  fVar186 = auVar18._0_4_;
  auVar187._0_4_ = fVar186 * auVar194._0_4_;
  fVar201 = auVar18._4_4_;
  auVar187._4_4_ = fVar201 * auVar194._4_4_;
  fVar202 = auVar18._8_4_;
  auVar187._8_4_ = fVar202 * auVar194._8_4_;
  fVar203 = auVar18._12_4_;
  auVar187._12_4_ = fVar203 * auVar194._12_4_;
  auVar277._8_4_ = 0x3f800000;
  auVar277._0_8_ = 0x3f8000003f800000;
  auVar277._12_4_ = 0x3f800000;
  auVar194 = vsubps_avx(auVar277,auVar187);
  fVar186 = fVar186 + fVar186 * auVar194._0_4_;
  fVar201 = fVar201 + fVar201 * auVar194._4_4_;
  fVar202 = fVar202 + fVar202 * auVar194._8_4_;
  fVar203 = fVar203 + fVar203 * auVar194._12_4_;
  auVar194 = vrcpps_avx(auVar181);
  fVar204 = auVar194._0_4_;
  auVar234._0_4_ = fVar204 * auVar181._0_4_;
  fVar229 = auVar194._4_4_;
  auVar234._4_4_ = fVar229 * auVar181._4_4_;
  fVar230 = auVar194._8_4_;
  auVar234._8_4_ = fVar230 * auVar181._8_4_;
  fVar231 = auVar194._12_4_;
  auVar234._12_4_ = fVar231 * auVar181._12_4_;
  auVar194 = vsubps_avx(auVar277,auVar234);
  fVar204 = fVar204 + fVar204 * auVar194._0_4_;
  fVar229 = fVar229 + fVar229 * auVar194._4_4_;
  fVar230 = fVar230 + fVar230 * auVar194._8_4_;
  fVar231 = fVar231 + fVar231 * auVar194._12_4_;
  auVar194 = vrcpps_avx(auVar96);
  fVar233 = auVar194._0_4_;
  auVar253._0_4_ = fVar233 * auVar96._0_4_;
  fVar250 = auVar194._4_4_;
  auVar253._4_4_ = fVar250 * auVar96._4_4_;
  fVar251 = auVar194._8_4_;
  auVar253._8_4_ = fVar251 * auVar96._8_4_;
  fVar252 = auVar194._12_4_;
  auVar253._12_4_ = fVar252 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar277,auVar253);
  fVar233 = fVar233 + fVar233 * auVar96._0_4_;
  fVar250 = fVar250 + fVar250 * auVar96._4_4_;
  fVar251 = fVar251 + fVar251 * auVar96._8_4_;
  fVar252 = fVar252 + fVar252 * auVar96._12_4_;
  auVar96 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar69 + 0x16)) *
                          *(float *)(prim + lVar69 + 0x1a)));
  auVar181 = vshufps_avx(auVar96,auVar96,0);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar194 = vpmovsxwd_avx(auVar194);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar18 = vsubps_avx(auVar194,auVar96);
  fVar76 = auVar181._0_4_;
  fVar151 = auVar181._4_4_;
  fVar184 = auVar181._8_4_;
  fVar185 = auVar181._12_4_;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar194 = vpmovsxwd_avx(auVar181);
  auVar267._0_4_ = auVar18._0_4_ * fVar76 + auVar96._0_4_;
  auVar267._4_4_ = auVar18._4_4_ * fVar151 + auVar96._4_4_;
  auVar267._8_4_ = auVar18._8_4_ * fVar184 + auVar96._8_4_;
  auVar267._12_4_ = auVar18._12_4_ * fVar185 + auVar96._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar181 = vpmovsxwd_avx(auVar18);
  auVar96 = vcvtdq2ps_avx(auVar194);
  auVar194 = vcvtdq2ps_avx(auVar181);
  auVar194 = vsubps_avx(auVar194,auVar96);
  auVar278._0_4_ = auVar194._0_4_ * fVar76 + auVar96._0_4_;
  auVar278._4_4_ = auVar194._4_4_ * fVar151 + auVar96._4_4_;
  auVar278._8_4_ = auVar194._8_4_ * fVar184 + auVar96._8_4_;
  auVar278._12_4_ = auVar194._12_4_ * fVar185 + auVar96._12_4_;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar96 = vpmovsxwd_avx(auVar161);
  uVar70 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar68 * 2 + uVar70 + 6);
  auVar194 = vpmovsxwd_avx(auVar19);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar194 = vsubps_avx(auVar194,auVar96);
  auVar294._0_4_ = auVar194._0_4_ * fVar76 + auVar96._0_4_;
  auVar294._4_4_ = auVar194._4_4_ * fVar151 + auVar96._4_4_;
  auVar294._8_4_ = auVar194._8_4_ * fVar184 + auVar96._8_4_;
  auVar294._12_4_ = auVar194._12_4_ * fVar185 + auVar96._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar70 + 6);
  auVar96 = vpmovsxwd_avx(auVar20);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar194 = vpmovsxwd_avx(auVar143);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar181 = vsubps_avx(auVar194,auVar96);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar194 = vpmovsxwd_avx(auVar131);
  auVar308._0_4_ = auVar181._0_4_ * fVar76 + auVar96._0_4_;
  auVar308._4_4_ = auVar181._4_4_ * fVar151 + auVar96._4_4_;
  auVar308._8_4_ = auVar181._8_4_ * fVar184 + auVar96._8_4_;
  auVar308._12_4_ = auVar181._12_4_ * fVar185 + auVar96._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar194);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar68 + (ulong)(byte)PVar10 * 0x20 + 6);
  auVar194 = vpmovsxwd_avx(auVar167);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar194 = vsubps_avx(auVar194,auVar96);
  auVar317._0_4_ = auVar194._0_4_ * fVar76 + auVar96._0_4_;
  auVar317._4_4_ = auVar194._4_4_ * fVar151 + auVar96._4_4_;
  auVar317._8_4_ = auVar194._8_4_ * fVar184 + auVar96._8_4_;
  auVar317._12_4_ = auVar194._12_4_ * fVar185 + auVar96._12_4_;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar68) + 6);
  auVar96 = vpmovsxwd_avx(auVar132);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar194 = vpmovsxwd_avx(auVar264);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar194 = vsubps_avx(auVar194,auVar96);
  auVar254._0_4_ = auVar96._0_4_ + auVar194._0_4_ * fVar76;
  auVar254._4_4_ = auVar96._4_4_ + auVar194._4_4_ * fVar151;
  auVar254._8_4_ = auVar96._8_4_ + auVar194._8_4_ * fVar184;
  auVar254._12_4_ = auVar96._12_4_ + auVar194._12_4_ * fVar185;
  auVar96 = vsubps_avx(auVar267,auVar119);
  auVar268._0_4_ = fVar186 * auVar96._0_4_;
  auVar268._4_4_ = fVar201 * auVar96._4_4_;
  auVar268._8_4_ = fVar202 * auVar96._8_4_;
  auVar268._12_4_ = fVar203 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar278,auVar119);
  auVar120._0_4_ = fVar186 * auVar96._0_4_;
  auVar120._4_4_ = fVar201 * auVar96._4_4_;
  auVar120._8_4_ = fVar202 * auVar96._8_4_;
  auVar120._12_4_ = fVar203 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar294,auVar77);
  auVar188._0_4_ = fVar204 * auVar96._0_4_;
  auVar188._4_4_ = fVar229 * auVar96._4_4_;
  auVar188._8_4_ = fVar230 * auVar96._8_4_;
  auVar188._12_4_ = fVar231 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar308,auVar77);
  auVar78._0_4_ = fVar204 * auVar96._0_4_;
  auVar78._4_4_ = fVar229 * auVar96._4_4_;
  auVar78._8_4_ = fVar230 * auVar96._8_4_;
  auVar78._12_4_ = fVar231 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar317,auVar152);
  auVar206._0_4_ = fVar233 * auVar96._0_4_;
  auVar206._4_4_ = fVar250 * auVar96._4_4_;
  auVar206._8_4_ = fVar251 * auVar96._8_4_;
  auVar206._12_4_ = fVar252 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar254,auVar152);
  auVar153._0_4_ = fVar233 * auVar96._0_4_;
  auVar153._4_4_ = fVar250 * auVar96._4_4_;
  auVar153._8_4_ = fVar251 * auVar96._8_4_;
  auVar153._12_4_ = fVar252 * auVar96._12_4_;
  auVar96 = vpminsd_avx(auVar268,auVar120);
  auVar194 = vpminsd_avx(auVar188,auVar78);
  auVar96 = vmaxps_avx(auVar96,auVar194);
  auVar194 = vpminsd_avx(auVar206,auVar153);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar279._4_4_ = uVar8;
  auVar279._0_4_ = uVar8;
  auVar279._8_4_ = uVar8;
  auVar279._12_4_ = uVar8;
  auVar194 = vmaxps_avx(auVar194,auVar279);
  auVar96 = vmaxps_avx(auVar96,auVar194);
  local_368._0_4_ = auVar96._0_4_ * 0.99999964;
  local_368._4_4_ = auVar96._4_4_ * 0.99999964;
  local_368._8_4_ = auVar96._8_4_ * 0.99999964;
  local_368._12_4_ = auVar96._12_4_ * 0.99999964;
  auVar96 = vpmaxsd_avx(auVar268,auVar120);
  auVar194 = vpmaxsd_avx(auVar188,auVar78);
  auVar96 = vminps_avx(auVar96,auVar194);
  auVar194 = vpmaxsd_avx(auVar206,auVar153);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar154._4_4_ = uVar8;
  auVar154._0_4_ = uVar8;
  auVar154._8_4_ = uVar8;
  auVar154._12_4_ = uVar8;
  auVar194 = vminps_avx(auVar194,auVar154);
  auVar96 = vminps_avx(auVar96,auVar194);
  auVar79._0_4_ = auVar96._0_4_ * 1.0000004;
  auVar79._4_4_ = auVar96._4_4_ * 1.0000004;
  auVar79._8_4_ = auVar96._8_4_ * 1.0000004;
  auVar79._12_4_ = auVar96._12_4_ * 1.0000004;
  auVar96 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar194 = vpcmpgtd_avx(auVar96,_DAT_01f7fcf0);
  auVar96 = vcmpps_avx(local_368,auVar79,2);
  auVar96 = vandps_avx(auVar96,auVar194);
  uVar66 = vmovmskps_avx(auVar96);
  if (uVar66 == 0) {
    return;
  }
  uVar66 = uVar66 & 0xff;
  local_428 = pre->ray_space + k;
  auVar109._16_16_ = mm_lookupmask_ps._240_16_;
  auVar109._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar109,ZEXT832(0) << 0x20,0x80);
  local_430 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar58 = ZEXT412(0);
  local_420 = prim;
  do {
    pLVar65 = local_428;
    auVar60._12_4_ = 0;
    auVar60._0_12_ = auVar58;
    lVar69 = 0;
    if (uVar66 != 0) {
      for (; (uVar66 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
      }
    }
    uVar67 = *(uint *)(local_420 + 2);
    uVar11 = *(uint *)(local_420 + lVar69 * 4 + 6);
    pGVar12 = (context->scene->geometries).items[uVar67].ptr;
    fVar76 = (pGVar12->time_range).lower;
    fVar76 = pGVar12->fnumTimeSegments *
             ((*(float *)(ray + k * 4 + 0x70) - fVar76) / ((pGVar12->time_range).upper - fVar76));
    auVar96 = vroundss_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76),9);
    auVar96 = vminss_avx(auVar96,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
    auVar96 = vmaxss_avx(auVar60 << 0x20,auVar96);
    uVar68 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                             (ulong)uVar11 *
                             pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar72 = (long)(int)auVar96._0_4_ * 0x38;
    lVar14 = *(long *)(_Var13 + lVar72);
    lVar15 = *(long *)(_Var13 + 0x10 + lVar72);
    pfVar3 = (float *)(lVar14 + lVar15 * uVar68);
    fVar151 = *pfVar3;
    fVar184 = pfVar3[1];
    fVar185 = pfVar3[2];
    fVar186 = pfVar3[3];
    lVar69 = uVar68 + 1;
    pfVar3 = (float *)(lVar14 + lVar15 * lVar69);
    lVar1 = uVar68 + 2;
    pfVar4 = (float *)(lVar14 + lVar15 * lVar1);
    lVar2 = uVar68 + 3;
    pfVar5 = (float *)(lVar14 + lVar15 * lVar2);
    fVar201 = *pfVar5;
    fVar202 = pfVar5[1];
    fVar203 = pfVar5[2];
    fVar204 = pfVar5[3];
    lVar14 = *(long *)&pGVar12[4].fnumTimeSegments;
    lVar15 = *(long *)(lVar14 + lVar72);
    lVar16 = *(long *)(lVar14 + 0x10 + lVar72);
    pfVar5 = (float *)(lVar15 + lVar16 * uVar68);
    fVar229 = *pfVar5;
    fVar230 = pfVar5[1];
    fVar231 = pfVar5[2];
    fVar233 = pfVar5[3];
    pfVar5 = (float *)(lVar15 + lVar16 * lVar69);
    pfVar6 = (float *)(lVar15 + lVar16 * lVar1);
    fVar76 = fVar76 - auVar96._0_4_;
    pfVar7 = (float *)(lVar15 + lVar16 * lVar2);
    fVar250 = *pfVar7;
    fVar251 = pfVar7[1];
    fVar252 = pfVar7[2];
    fVar232 = pfVar7[3];
    fVar293 = *pfVar4 * 0.0;
    fVar301 = pfVar4[1] * 0.0;
    fVar302 = pfVar4[2] * 0.0;
    fVar303 = pfVar4[3] * 0.0;
    fVar75 = fVar293 + fVar201 * 0.0;
    fVar115 = fVar301 + fVar202 * 0.0;
    fVar116 = fVar302 + fVar203 * 0.0;
    fVar117 = fVar303 + fVar204 * 0.0;
    fVar315 = *pfVar3 * 0.0;
    fVar325 = pfVar3[1] * 0.0;
    fVar327 = pfVar3[2] * 0.0;
    fVar329 = pfVar3[3] * 0.0;
    local_5f8._0_4_ = fVar151 + fVar315 + fVar75;
    local_5f8._4_4_ = fVar184 + fVar325 + fVar115;
    fStack_5f0 = fVar185 + fVar327 + fVar116;
    fStack_5ec = fVar186 + fVar329 + fVar117;
    auVar80._0_4_ = *pfVar3 * 3.0 + fVar75;
    auVar80._4_4_ = pfVar3[1] * 3.0 + fVar115;
    auVar80._8_4_ = pfVar3[2] * 3.0 + fVar116;
    auVar80._12_4_ = pfVar3[3] * 3.0 + fVar117;
    auVar155._0_4_ = fVar151 * 3.0;
    auVar155._4_4_ = fVar184 * 3.0;
    auVar155._8_4_ = fVar185 * 3.0;
    auVar155._12_4_ = fVar186 * 3.0;
    auVar143 = vsubps_avx(auVar80,auVar155);
    fVar331 = *pfVar6 * 0.0;
    fVar337 = pfVar6[1] * 0.0;
    fVar338 = pfVar6[2] * 0.0;
    fVar339 = pfVar6[3] * 0.0;
    fVar75 = fVar331 + fVar250 * 0.0;
    fVar115 = fVar337 + fVar251 * 0.0;
    fVar116 = fVar338 + fVar252 * 0.0;
    fVar117 = fVar339 + fVar232 * 0.0;
    fVar344 = *pfVar5 * 0.0;
    fVar348 = pfVar5[1] * 0.0;
    fVar349 = pfVar5[2] * 0.0;
    fVar350 = pfVar5[3] * 0.0;
    auVar352._0_4_ = fVar344 + fVar75 + fVar229;
    auVar352._4_4_ = fVar348 + fVar115 + fVar230;
    auVar352._8_4_ = fVar349 + fVar116 + fVar231;
    auVar352._12_4_ = fVar350 + fVar117 + fVar233;
    auVar81._0_4_ = *pfVar5 * 3.0 + fVar75;
    auVar81._4_4_ = pfVar5[1] * 3.0 + fVar115;
    auVar81._8_4_ = pfVar5[2] * 3.0 + fVar116;
    auVar81._12_4_ = pfVar5[3] * 3.0 + fVar117;
    auVar255._0_4_ = fVar229 * 3.0;
    auVar255._4_4_ = fVar230 * 3.0;
    auVar255._8_4_ = fVar231 * 3.0;
    auVar255._12_4_ = fVar233 * 3.0;
    auVar18 = vsubps_avx(auVar81,auVar255);
    auVar189._0_4_ = fVar151 * 0.0;
    auVar189._4_4_ = fVar184 * 0.0;
    auVar189._8_4_ = fVar185 * 0.0;
    auVar189._12_4_ = fVar186 * 0.0;
    auVar256._0_4_ = auVar189._0_4_ + fVar315 + fVar293 + fVar201;
    auVar256._4_4_ = auVar189._4_4_ + fVar325 + fVar301 + fVar202;
    auVar256._8_4_ = auVar189._8_4_ + fVar327 + fVar302 + fVar203;
    auVar256._12_4_ = auVar189._12_4_ + fVar329 + fVar303 + fVar204;
    auVar269._0_4_ = fVar201 * 3.0;
    auVar269._4_4_ = fVar202 * 3.0;
    auVar269._8_4_ = fVar203 * 3.0;
    auVar269._12_4_ = fVar204 * 3.0;
    auVar207._0_4_ = *pfVar4 * 3.0;
    auVar207._4_4_ = pfVar4[1] * 3.0;
    auVar207._8_4_ = pfVar4[2] * 3.0;
    auVar207._12_4_ = pfVar4[3] * 3.0;
    auVar96 = vsubps_avx(auVar269,auVar207);
    auVar208._0_4_ = fVar315 + auVar96._0_4_;
    auVar208._4_4_ = fVar325 + auVar96._4_4_;
    auVar208._8_4_ = fVar327 + auVar96._8_4_;
    auVar208._12_4_ = fVar329 + auVar96._12_4_;
    auVar131 = vsubps_avx(auVar208,auVar189);
    auVar209._0_4_ = fVar229 * 0.0;
    auVar209._4_4_ = fVar230 * 0.0;
    auVar209._8_4_ = fVar231 * 0.0;
    auVar209._12_4_ = fVar233 * 0.0;
    auVar190._0_4_ = auVar209._0_4_ + fVar344 + fVar331 + fVar250;
    auVar190._4_4_ = auVar209._4_4_ + fVar348 + fVar337 + fVar251;
    auVar190._8_4_ = auVar209._8_4_ + fVar349 + fVar338 + fVar252;
    auVar190._12_4_ = auVar209._12_4_ + fVar350 + fVar339 + fVar232;
    auVar235._0_4_ = fVar250 * 3.0;
    auVar235._4_4_ = fVar251 * 3.0;
    auVar235._8_4_ = fVar252 * 3.0;
    auVar235._12_4_ = fVar232 * 3.0;
    auVar270._0_4_ = *pfVar6 * 3.0;
    auVar270._4_4_ = pfVar6[1] * 3.0;
    auVar270._8_4_ = pfVar6[2] * 3.0;
    auVar270._12_4_ = pfVar6[3] * 3.0;
    auVar96 = vsubps_avx(auVar235,auVar270);
    auVar236._0_4_ = fVar344 + auVar96._0_4_;
    auVar236._4_4_ = fVar348 + auVar96._4_4_;
    auVar236._8_4_ = fVar349 + auVar96._8_4_;
    auVar236._12_4_ = fVar350 + auVar96._12_4_;
    auVar19 = vsubps_avx(auVar236,auVar209);
    auVar96 = vshufps_avx(auVar143,auVar143,0xc9);
    auVar194 = vshufps_avx(auVar352,auVar352,0xc9);
    fVar75 = auVar143._0_4_;
    auVar237._0_4_ = fVar75 * auVar194._0_4_;
    fVar115 = auVar143._4_4_;
    auVar237._4_4_ = fVar115 * auVar194._4_4_;
    fVar116 = auVar143._8_4_;
    auVar237._8_4_ = fVar116 * auVar194._8_4_;
    fVar117 = auVar143._12_4_;
    auVar237._12_4_ = fVar117 * auVar194._12_4_;
    auVar280._0_4_ = auVar352._0_4_ * auVar96._0_4_;
    auVar280._4_4_ = auVar352._4_4_ * auVar96._4_4_;
    auVar280._8_4_ = auVar352._8_4_ * auVar96._8_4_;
    auVar280._12_4_ = auVar352._12_4_ * auVar96._12_4_;
    auVar194 = vsubps_avx(auVar280,auVar237);
    auVar181 = vshufps_avx(auVar194,auVar194,0xc9);
    auVar194 = vshufps_avx(auVar18,auVar18,0xc9);
    auVar281._0_4_ = auVar194._0_4_ * fVar75;
    auVar281._4_4_ = auVar194._4_4_ * fVar115;
    auVar281._8_4_ = auVar194._8_4_ * fVar116;
    auVar281._12_4_ = auVar194._12_4_ * fVar117;
    auVar82._0_4_ = auVar96._0_4_ * auVar18._0_4_;
    auVar82._4_4_ = auVar96._4_4_ * auVar18._4_4_;
    auVar82._8_4_ = auVar96._8_4_ * auVar18._8_4_;
    auVar82._12_4_ = auVar96._12_4_ * auVar18._12_4_;
    auVar96 = vsubps_avx(auVar82,auVar281);
    auVar18 = vshufps_avx(auVar96,auVar96,0xc9);
    auVar96 = vshufps_avx(auVar131,auVar131,0xc9);
    auVar194 = vshufps_avx(auVar190,auVar190,0xc9);
    fVar344 = auVar131._0_4_;
    auVar282._0_4_ = fVar344 * auVar194._0_4_;
    fVar348 = auVar131._4_4_;
    auVar282._4_4_ = fVar348 * auVar194._4_4_;
    fVar349 = auVar131._8_4_;
    auVar282._8_4_ = fVar349 * auVar194._8_4_;
    fVar350 = auVar131._12_4_;
    auVar282._12_4_ = fVar350 * auVar194._12_4_;
    auVar191._0_4_ = auVar96._0_4_ * auVar190._0_4_;
    auVar191._4_4_ = auVar96._4_4_ * auVar190._4_4_;
    auVar191._8_4_ = auVar96._8_4_ * auVar190._8_4_;
    auVar191._12_4_ = auVar96._12_4_ * auVar190._12_4_;
    auVar194 = vsubps_avx(auVar191,auVar282);
    auVar161 = vshufps_avx(auVar194,auVar194,0xc9);
    auVar194 = vshufps_avx(auVar19,auVar19,0xc9);
    auVar283._0_4_ = fVar344 * auVar194._0_4_;
    auVar283._4_4_ = fVar348 * auVar194._4_4_;
    auVar283._8_4_ = fVar349 * auVar194._8_4_;
    auVar283._12_4_ = fVar350 * auVar194._12_4_;
    auVar210._0_4_ = auVar96._0_4_ * auVar19._0_4_;
    auVar210._4_4_ = auVar96._4_4_ * auVar19._4_4_;
    auVar210._8_4_ = auVar96._8_4_ * auVar19._8_4_;
    auVar210._12_4_ = auVar96._12_4_ * auVar19._12_4_;
    auVar96 = vdpps_avx(auVar181,auVar181,0x7f);
    auVar194 = vsubps_avx(auVar210,auVar283);
    auVar19 = vshufps_avx(auVar194,auVar194,0xc9);
    fVar184 = auVar96._0_4_;
    auVar284._4_12_ = ZEXT812(0) << 0x20;
    auVar284._0_4_ = fVar184;
    auVar194 = vrsqrtss_avx(auVar284,auVar284);
    fVar151 = auVar194._0_4_;
    auVar194 = ZEXT416((uint)(fVar151 * 1.5 - fVar184 * 0.5 * fVar151 * fVar151 * fVar151));
    auVar20 = vshufps_avx(auVar194,auVar194,0);
    fVar250 = auVar20._0_4_ * auVar181._0_4_;
    fVar251 = auVar20._4_4_ * auVar181._4_4_;
    fVar252 = auVar20._8_4_ * auVar181._8_4_;
    fVar232 = auVar20._12_4_ * auVar181._12_4_;
    auVar194 = vdpps_avx(auVar181,auVar18,0x7f);
    auVar96 = vshufps_avx(auVar96,auVar96,0);
    auVar83._0_4_ = auVar96._0_4_ * auVar18._0_4_;
    auVar83._4_4_ = auVar96._4_4_ * auVar18._4_4_;
    auVar83._8_4_ = auVar96._8_4_ * auVar18._8_4_;
    auVar83._12_4_ = auVar96._12_4_ * auVar18._12_4_;
    auVar96 = vshufps_avx(auVar194,auVar194,0);
    auVar238._0_4_ = auVar96._0_4_ * auVar181._0_4_;
    auVar238._4_4_ = auVar96._4_4_ * auVar181._4_4_;
    auVar238._8_4_ = auVar96._8_4_ * auVar181._8_4_;
    auVar238._12_4_ = auVar96._12_4_ * auVar181._12_4_;
    auVar167 = vsubps_avx(auVar83,auVar238);
    auVar96 = vrcpss_avx(auVar284,auVar284);
    auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar184 * auVar96._0_4_)));
    auVar181 = vshufps_avx(auVar96,auVar96,0);
    auVar96 = vdpps_avx(auVar161,auVar161,0x7f);
    fVar293 = auVar96._0_4_;
    auVar285._4_12_ = ZEXT812(0) << 0x20;
    auVar285._0_4_ = fVar293;
    auVar194 = vrsqrtss_avx(auVar285,auVar285);
    fVar229 = auVar194._0_4_;
    auVar194 = vdpps_avx(auVar161,auVar19,0x7f);
    auVar96 = vshufps_avx(auVar96,auVar96,0);
    auVar360._0_4_ = auVar19._0_4_ * auVar96._0_4_;
    auVar360._4_4_ = auVar19._4_4_ * auVar96._4_4_;
    auVar360._8_4_ = auVar19._8_4_ * auVar96._8_4_;
    auVar360._12_4_ = auVar19._12_4_ * auVar96._12_4_;
    lVar15 = *(long *)(_Var13 + 0x38 + lVar72);
    lVar16 = *(long *)(_Var13 + 0x48 + lVar72);
    pfVar3 = (float *)(lVar15 + lVar16 * uVar68);
    fVar151 = *pfVar3;
    fVar184 = pfVar3[1];
    fVar185 = pfVar3[2];
    fVar186 = pfVar3[3];
    pfVar3 = (float *)(lVar15 + lVar16 * lVar69);
    pfVar4 = (float *)(lVar15 + lVar16 * lVar1);
    auVar96 = vshufps_avx(auVar194,auVar194,0);
    auVar84._0_4_ = auVar161._0_4_ * auVar96._0_4_;
    auVar84._4_4_ = auVar161._4_4_ * auVar96._4_4_;
    auVar84._8_4_ = auVar161._8_4_ * auVar96._8_4_;
    auVar84._12_4_ = auVar161._12_4_ * auVar96._12_4_;
    auVar19 = vsubps_avx(auVar360,auVar84);
    pfVar5 = (float *)(lVar15 + lVar16 * lVar2);
    fVar201 = *pfVar5;
    fVar202 = pfVar5[1];
    fVar203 = pfVar5[2];
    fVar204 = pfVar5[3];
    auVar96 = ZEXT416((uint)(fVar229 * 1.5 - fVar293 * 0.5 * fVar229 * fVar229 * fVar229));
    auVar194 = vshufps_avx(auVar96,auVar96,0);
    fVar229 = auVar194._0_4_ * auVar161._0_4_;
    fVar230 = auVar194._4_4_ * auVar161._4_4_;
    fVar231 = auVar194._8_4_ * auVar161._8_4_;
    fVar233 = auVar194._12_4_ * auVar161._12_4_;
    auVar96 = vrcpss_avx(auVar285,auVar285);
    auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - auVar96._0_4_ * fVar293)));
    auVar96 = vshufps_avx(auVar96,auVar96,0);
    auVar18 = vshufps_avx(_local_5f8,_local_5f8,0xff);
    auVar353._0_4_ = auVar18._0_4_ * fVar250;
    auVar353._4_4_ = auVar18._4_4_ * fVar251;
    auVar353._8_4_ = auVar18._8_4_ * fVar252;
    auVar353._12_4_ = auVar18._12_4_ * fVar232;
    auVar161 = vshufps_avx(auVar143,auVar143,0xff);
    auVar132 = vsubps_avx(_local_5f8,auVar353);
    auVar271._0_4_ =
         auVar161._0_4_ * fVar250 + auVar18._0_4_ * auVar20._0_4_ * auVar167._0_4_ * auVar181._0_4_;
    auVar271._4_4_ =
         auVar161._4_4_ * fVar251 + auVar18._4_4_ * auVar20._4_4_ * auVar167._4_4_ * auVar181._4_4_;
    auVar271._8_4_ =
         auVar161._8_4_ * fVar252 + auVar18._8_4_ * auVar20._8_4_ * auVar167._8_4_ * auVar181._8_4_;
    auVar271._12_4_ =
         auVar161._12_4_ * fVar232 +
         auVar18._12_4_ * auVar20._12_4_ * auVar167._12_4_ * auVar181._12_4_;
    auVar20 = vsubps_avx(auVar143,auVar271);
    local_5f8._0_4_ = (float)local_5f8._0_4_ + auVar353._0_4_;
    local_5f8._4_4_ = (float)local_5f8._4_4_ + auVar353._4_4_;
    fStack_5f0 = fStack_5f0 + auVar353._8_4_;
    fStack_5ec = fStack_5ec + auVar353._12_4_;
    auVar181 = vshufps_avx(auVar256,auVar256,0xff);
    auVar156._0_4_ = auVar181._0_4_ * fVar229;
    auVar156._4_4_ = auVar181._4_4_ * fVar230;
    auVar156._8_4_ = auVar181._8_4_ * fVar231;
    auVar156._12_4_ = auVar181._12_4_ * fVar233;
    auVar18 = vshufps_avx(auVar131,auVar131,0xff);
    auVar143 = vsubps_avx(auVar256,auVar156);
    auVar85._0_4_ =
         auVar18._0_4_ * fVar229 + auVar181._0_4_ * auVar194._0_4_ * auVar19._0_4_ * auVar96._0_4_;
    auVar85._4_4_ =
         auVar18._4_4_ * fVar230 + auVar181._4_4_ * auVar194._4_4_ * auVar19._4_4_ * auVar96._4_4_;
    auVar85._8_4_ =
         auVar18._8_4_ * fVar231 + auVar181._8_4_ * auVar194._8_4_ * auVar19._8_4_ * auVar96._8_4_;
    auVar85._12_4_ =
         auVar18._12_4_ * fVar233 +
         auVar181._12_4_ * auVar194._12_4_ * auVar19._12_4_ * auVar96._12_4_;
    auVar131 = vsubps_avx(auVar131,auVar85);
    local_458._4_4_ = auVar256._4_4_ + auVar156._4_4_;
    local_458._0_4_ = auVar256._0_4_ + auVar156._0_4_;
    fStack_450 = auVar256._8_4_ + auVar156._8_4_;
    fStack_44c = auVar256._12_4_ + auVar156._12_4_;
    fVar315 = *pfVar4 * 0.0;
    fVar325 = pfVar4[1] * 0.0;
    fVar327 = pfVar4[2] * 0.0;
    fVar329 = pfVar4[3] * 0.0;
    fVar359 = fVar315 + fVar201 * 0.0;
    fVar363 = fVar325 + fVar202 * 0.0;
    fVar364 = fVar327 + fVar203 * 0.0;
    fVar366 = fVar329 + fVar204 * 0.0;
    auVar86._0_4_ = fVar359 + *pfVar3 * 3.0;
    auVar86._4_4_ = fVar363 + pfVar3[1] * 3.0;
    auVar86._8_4_ = fVar364 + pfVar3[2] * 3.0;
    auVar86._12_4_ = fVar366 + pfVar3[3] * 3.0;
    auVar157._0_4_ = fVar151 * 3.0;
    auVar157._4_4_ = fVar184 * 3.0;
    auVar157._8_4_ = fVar185 * 3.0;
    auVar157._12_4_ = fVar186 * 3.0;
    auVar167 = vsubps_avx(auVar86,auVar157);
    lVar15 = *(long *)(lVar14 + 0x38 + lVar72);
    lVar14 = *(long *)(lVar14 + 0x48 + lVar72);
    auVar96 = *(undefined1 (*) [16])(lVar15 + lVar1 * lVar14);
    pfVar5 = (float *)(lVar15 + lVar14 * lVar2);
    fVar229 = *pfVar5;
    fVar230 = pfVar5[1];
    fVar231 = pfVar5[2];
    fVar233 = pfVar5[3];
    fVar293 = auVar96._0_4_ * 0.0;
    fVar301 = auVar96._4_4_ * 0.0;
    fVar302 = auVar96._8_4_ * 0.0;
    fVar303 = auVar96._12_4_ * 0.0;
    fVar331 = fVar293 + fVar229 * 0.0;
    fVar337 = fVar301 + fVar230 * 0.0;
    fVar338 = fVar302 + fVar231 * 0.0;
    fVar339 = fVar303 + fVar233 * 0.0;
    pfVar5 = (float *)(lVar15 + lVar69 * lVar14);
    auVar354._0_4_ = *pfVar5 * 3.0 + fVar331;
    auVar354._4_4_ = pfVar5[1] * 3.0 + fVar337;
    auVar354._8_4_ = pfVar5[2] * 3.0 + fVar338;
    auVar354._12_4_ = pfVar5[3] * 3.0 + fVar339;
    pfVar6 = (float *)(lVar15 + uVar68 * lVar14);
    fVar250 = *pfVar6;
    fVar251 = pfVar6[1];
    fVar252 = pfVar6[2];
    fVar232 = pfVar6[3];
    auVar286._0_4_ = fVar250 * 3.0;
    auVar286._4_4_ = fVar251 * 3.0;
    auVar286._8_4_ = fVar252 * 3.0;
    auVar286._12_4_ = fVar232 * 3.0;
    auVar194 = vsubps_avx(auVar354,auVar286);
    auVar287._0_4_ = fVar201 * 3.0;
    auVar287._4_4_ = fVar202 * 3.0;
    auVar287._8_4_ = fVar203 * 3.0;
    auVar287._12_4_ = fVar204 * 3.0;
    auVar333._0_4_ = *pfVar4 * 3.0;
    auVar333._4_4_ = pfVar4[1] * 3.0;
    auVar333._8_4_ = pfVar4[2] * 3.0;
    auVar333._12_4_ = pfVar4[3] * 3.0;
    auVar181 = vsubps_avx(auVar287,auVar333);
    fVar316 = *pfVar3 * 0.0;
    fVar326 = pfVar3[1] * 0.0;
    fVar328 = pfVar3[2] * 0.0;
    fVar330 = pfVar3[3] * 0.0;
    auVar288._0_4_ = fVar316 + auVar181._0_4_;
    auVar288._4_4_ = fVar326 + auVar181._4_4_;
    auVar288._8_4_ = fVar328 + auVar181._8_4_;
    auVar288._12_4_ = fVar330 + auVar181._12_4_;
    auVar334._0_4_ = fVar151 + fVar316 + fVar359;
    auVar334._4_4_ = fVar184 + fVar326 + fVar363;
    auVar334._8_4_ = fVar185 + fVar328 + fVar364;
    auVar334._12_4_ = fVar186 + fVar330 + fVar366;
    auVar309._0_4_ = fVar151 * 0.0;
    auVar309._4_4_ = fVar184 * 0.0;
    auVar309._8_4_ = fVar185 * 0.0;
    auVar309._12_4_ = fVar186 * 0.0;
    local_488._0_4_ = auVar309._0_4_ + fVar316 + fVar201 + fVar315;
    local_488._4_4_ = auVar309._4_4_ + fVar326 + fVar202 + fVar325;
    fStack_480 = auVar309._8_4_ + fVar328 + fVar203 + fVar327;
    fStack_47c = auVar309._12_4_ + fVar330 + fVar204 + fVar329;
    auVar264 = vsubps_avx(auVar288,auVar309);
    auVar121._0_4_ = fVar229 * 3.0;
    auVar121._4_4_ = fVar230 * 3.0;
    auVar121._8_4_ = fVar231 * 3.0;
    auVar121._12_4_ = fVar233 * 3.0;
    auVar211._0_4_ = auVar96._0_4_ * 3.0;
    auVar211._4_4_ = auVar96._4_4_ * 3.0;
    auVar211._8_4_ = auVar96._8_4_ * 3.0;
    auVar211._12_4_ = auVar96._12_4_ * 3.0;
    auVar96 = vsubps_avx(auVar121,auVar211);
    fVar151 = *pfVar5 * 0.0;
    fVar184 = pfVar5[1] * 0.0;
    fVar185 = pfVar5[2] * 0.0;
    fVar186 = pfVar5[3] * 0.0;
    auVar122._0_4_ = fVar151 + auVar96._0_4_;
    auVar122._4_4_ = fVar184 + auVar96._4_4_;
    auVar122._8_4_ = fVar185 + auVar96._8_4_;
    auVar122._12_4_ = fVar186 + auVar96._12_4_;
    auVar158._0_4_ = fVar250 + fVar151 + fVar331;
    auVar158._4_4_ = fVar251 + fVar184 + fVar337;
    auVar158._8_4_ = fVar252 + fVar185 + fVar338;
    auVar158._12_4_ = fVar232 + fVar186 + fVar339;
    auVar87._0_4_ = fVar250 * 0.0;
    auVar87._4_4_ = fVar251 * 0.0;
    auVar87._8_4_ = fVar252 * 0.0;
    auVar87._12_4_ = fVar232 * 0.0;
    auVar192._0_4_ = auVar87._0_4_ + fVar151 + fVar293 + fVar229;
    auVar192._4_4_ = auVar87._4_4_ + fVar184 + fVar301 + fVar230;
    auVar192._8_4_ = auVar87._8_4_ + fVar185 + fVar302 + fVar231;
    auVar192._12_4_ = auVar87._12_4_ + fVar186 + fVar303 + fVar233;
    auVar18 = vsubps_avx(auVar122,auVar87);
    auVar96 = vshufps_avx(auVar158,auVar158,0xc9);
    fVar204 = auVar167._0_4_;
    auVar123._0_4_ = fVar204 * auVar96._0_4_;
    fVar229 = auVar167._4_4_;
    auVar123._4_4_ = fVar229 * auVar96._4_4_;
    fVar230 = auVar167._8_4_;
    auVar123._8_4_ = fVar230 * auVar96._8_4_;
    fVar231 = auVar167._12_4_;
    auVar123._12_4_ = fVar231 * auVar96._12_4_;
    auVar96 = vshufps_avx(auVar167,auVar167,0xc9);
    auVar159._0_4_ = auVar96._0_4_ * auVar158._0_4_;
    auVar159._4_4_ = auVar96._4_4_ * auVar158._4_4_;
    auVar159._8_4_ = auVar96._8_4_ * auVar158._8_4_;
    auVar159._12_4_ = auVar96._12_4_ * auVar158._12_4_;
    auVar181 = vsubps_avx(auVar159,auVar123);
    auVar160._0_4_ = auVar194._0_4_ * auVar96._0_4_;
    auVar160._4_4_ = auVar194._4_4_ * auVar96._4_4_;
    auVar160._8_4_ = auVar194._8_4_ * auVar96._8_4_;
    auVar160._12_4_ = auVar194._12_4_ * auVar96._12_4_;
    auVar96 = vshufps_avx(auVar194,auVar194,0xc9);
    auVar212._0_4_ = fVar204 * auVar96._0_4_;
    auVar212._4_4_ = fVar229 * auVar96._4_4_;
    auVar212._8_4_ = fVar230 * auVar96._8_4_;
    auVar212._12_4_ = fVar231 * auVar96._12_4_;
    auVar161 = vsubps_avx(auVar160,auVar212);
    auVar96 = vshufps_avx(auVar192,auVar192,0xc9);
    fVar233 = auVar264._0_4_;
    auVar213._0_4_ = fVar233 * auVar96._0_4_;
    fVar250 = auVar264._4_4_;
    auVar213._4_4_ = fVar250 * auVar96._4_4_;
    fVar251 = auVar264._8_4_;
    auVar213._8_4_ = fVar251 * auVar96._8_4_;
    fVar252 = auVar264._12_4_;
    auVar213._12_4_ = fVar252 * auVar96._12_4_;
    auVar96 = vshufps_avx(auVar264,auVar264,0xc9);
    auVar193._0_4_ = auVar96._0_4_ * auVar192._0_4_;
    auVar193._4_4_ = auVar96._4_4_ * auVar192._4_4_;
    auVar193._8_4_ = auVar96._8_4_ * auVar192._8_4_;
    auVar193._12_4_ = auVar96._12_4_ * auVar192._12_4_;
    auVar19 = vsubps_avx(auVar193,auVar213);
    auVar181 = vshufps_avx(auVar181,auVar181,0xc9);
    auVar124._0_4_ = auVar96._0_4_ * auVar18._0_4_;
    auVar124._4_4_ = auVar96._4_4_ * auVar18._4_4_;
    auVar124._8_4_ = auVar96._8_4_ * auVar18._8_4_;
    auVar124._12_4_ = auVar96._12_4_ * auVar18._12_4_;
    auVar194 = vshufps_avx(auVar18,auVar18,0xc9);
    auVar96 = vdpps_avx(auVar181,auVar181,0x7f);
    auVar88._0_4_ = fVar233 * auVar194._0_4_;
    auVar88._4_4_ = fVar250 * auVar194._4_4_;
    auVar88._8_4_ = fVar251 * auVar194._8_4_;
    auVar88._12_4_ = fVar252 * auVar194._12_4_;
    auVar77 = vsubps_avx(auVar124,auVar88);
    auVar18 = vshufps_avx(auVar161,auVar161,0xc9);
    fVar151 = auVar96._0_4_;
    auVar161 = ZEXT416((uint)fVar151);
    auVar194 = vrsqrtss_avx(auVar161,auVar161);
    fVar184 = auVar194._0_4_;
    auVar194 = vdpps_avx(auVar181,auVar18,0x7f);
    auVar96 = vshufps_avx(auVar96,auVar96,0);
    auVar89._0_4_ = auVar96._0_4_ * auVar18._0_4_;
    auVar89._4_4_ = auVar96._4_4_ * auVar18._4_4_;
    auVar89._8_4_ = auVar96._8_4_ * auVar18._8_4_;
    auVar89._12_4_ = auVar96._12_4_ * auVar18._12_4_;
    auVar96 = vshufps_avx(auVar194,auVar194,0);
    auVar239._0_4_ = auVar181._0_4_ * auVar96._0_4_;
    auVar239._4_4_ = auVar181._4_4_ * auVar96._4_4_;
    auVar239._8_4_ = auVar181._8_4_ * auVar96._8_4_;
    auVar239._12_4_ = auVar181._12_4_ * auVar96._12_4_;
    auVar78 = vsubps_avx(auVar89,auVar239);
    auVar96 = vrcpss_avx(auVar161,auVar161);
    auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar151 * auVar96._0_4_)));
    auVar18 = vshufps_avx(auVar96,auVar96,0);
    auVar161 = vshufps_avx(auVar19,auVar19,0xc9);
    auVar96 = ZEXT416((uint)(fVar184 * 1.5 - fVar151 * 0.5 * fVar184 * fVar184 * fVar184));
    auVar19 = vshufps_avx(auVar96,auVar96,0);
    auVar96 = vdpps_avx(auVar161,auVar161,0x7f);
    fVar201 = auVar181._0_4_ * auVar19._0_4_;
    fVar202 = auVar181._4_4_ * auVar19._4_4_;
    fVar203 = auVar181._8_4_ * auVar19._8_4_;
    fVar232 = auVar181._12_4_ * auVar19._12_4_;
    auVar181 = vshufps_avx(auVar77,auVar77,0xc9);
    fVar184 = auVar96._0_4_;
    auVar79 = ZEXT416((uint)fVar184);
    auVar194 = vrsqrtss_avx(auVar79,auVar79);
    fVar151 = auVar194._0_4_;
    auVar194 = vdpps_avx(auVar161,auVar181,0x7f);
    auVar96 = vshufps_avx(auVar96,auVar96,0);
    auVar125._0_4_ = auVar96._0_4_ * auVar181._0_4_;
    auVar125._4_4_ = auVar96._4_4_ * auVar181._4_4_;
    auVar125._8_4_ = auVar96._8_4_ * auVar181._8_4_;
    auVar125._12_4_ = auVar96._12_4_ * auVar181._12_4_;
    auVar96 = vshufps_avx(auVar194,auVar194,0);
    auVar240._0_4_ = auVar161._0_4_ * auVar96._0_4_;
    auVar240._4_4_ = auVar161._4_4_ * auVar96._4_4_;
    auVar240._8_4_ = auVar161._8_4_ * auVar96._8_4_;
    auVar240._12_4_ = auVar161._12_4_ * auVar96._12_4_;
    auVar77 = vsubps_avx(auVar125,auVar240);
    auVar96 = vrcpss_avx(auVar79,auVar79);
    auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar184 * auVar96._0_4_)));
    auVar96 = vshufps_avx(auVar96,auVar96,0);
    auVar194 = ZEXT416((uint)(fVar151 * 1.5 - fVar184 * 0.5 * fVar151 * fVar151 * fVar151));
    auVar194 = vshufps_avx(auVar194,auVar194,0);
    fVar151 = auVar161._0_4_ * auVar194._0_4_;
    fVar184 = auVar161._4_4_ * auVar194._4_4_;
    fVar185 = auVar161._8_4_ * auVar194._8_4_;
    fVar186 = auVar161._12_4_ * auVar194._12_4_;
    auVar181 = vshufps_avx(auVar167,auVar167,0xff);
    auVar161 = vshufps_avx(auVar334,auVar334,0xff);
    auVar214._0_4_ = fVar201 * auVar161._0_4_;
    auVar214._4_4_ = fVar202 * auVar161._4_4_;
    auVar214._8_4_ = fVar203 * auVar161._8_4_;
    auVar214._12_4_ = fVar232 * auVar161._12_4_;
    auVar162._0_4_ =
         fVar201 * auVar181._0_4_ + auVar19._0_4_ * auVar78._0_4_ * auVar18._0_4_ * auVar161._0_4_;
    auVar162._4_4_ =
         fVar202 * auVar181._4_4_ + auVar19._4_4_ * auVar78._4_4_ * auVar18._4_4_ * auVar161._4_4_;
    auVar162._8_4_ =
         fVar203 * auVar181._8_4_ + auVar19._8_4_ * auVar78._8_4_ * auVar18._8_4_ * auVar161._8_4_;
    auVar162._12_4_ =
         fVar232 * auVar181._12_4_ +
         auVar19._12_4_ * auVar78._12_4_ * auVar18._12_4_ * auVar161._12_4_;
    auVar161 = vsubps_avx(auVar334,auVar214);
    auVar19 = vsubps_avx(auVar167,auVar162);
    auVar181 = vshufps_avx(auVar264,auVar264,0xff);
    auVar18 = vshufps_avx(_local_488,_local_488,0xff);
    auVar90._0_4_ = auVar18._0_4_ * fVar151;
    auVar90._4_4_ = auVar18._4_4_ * fVar184;
    auVar90._8_4_ = auVar18._8_4_ * fVar185;
    auVar90._12_4_ = auVar18._12_4_ * fVar186;
    auVar126._0_4_ =
         auVar181._0_4_ * fVar151 + auVar18._0_4_ * auVar194._0_4_ * auVar77._0_4_ * auVar96._0_4_;
    auVar126._4_4_ =
         auVar181._4_4_ * fVar184 + auVar18._4_4_ * auVar194._4_4_ * auVar77._4_4_ * auVar96._4_4_;
    auVar126._8_4_ =
         auVar181._8_4_ * fVar185 + auVar18._8_4_ * auVar194._8_4_ * auVar77._8_4_ * auVar96._8_4_;
    auVar126._12_4_ =
         auVar181._12_4_ * fVar186 +
         auVar18._12_4_ * auVar194._12_4_ * auVar77._12_4_ * auVar96._12_4_;
    auVar181 = vsubps_avx(_local_488,auVar90);
    auVar346._0_4_ = (float)local_488._0_4_ + auVar90._0_4_;
    auVar346._4_4_ = (float)local_488._4_4_ + auVar90._4_4_;
    auVar346._8_4_ = fStack_480 + auVar90._8_4_;
    auVar346._12_4_ = fStack_47c + auVar90._12_4_;
    auVar18 = vsubps_avx(auVar264,auVar126);
    local_588 = auVar20._0_4_;
    fStack_584 = auVar20._4_4_;
    fStack_580 = auVar20._8_4_;
    fStack_57c = auVar20._12_4_;
    local_518 = auVar132._0_4_;
    fStack_514 = auVar132._4_4_;
    fStack_510 = auVar132._8_4_;
    fStack_50c = auVar132._12_4_;
    auVar96 = vshufps_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76),0);
    auVar194 = vshufps_avx(ZEXT416((uint)(1.0 - fVar76)),ZEXT416((uint)(1.0 - fVar76)),0);
    fVar186 = auVar96._0_4_;
    fVar201 = auVar96._4_4_;
    fVar202 = auVar96._8_4_;
    fVar203 = auVar96._12_4_;
    fVar76 = auVar194._0_4_;
    fVar151 = auVar194._4_4_;
    fVar184 = auVar194._8_4_;
    fVar185 = auVar194._12_4_;
    local_3a8._0_4_ = fVar76 * local_518 + fVar186 * auVar161._0_4_;
    local_3a8._4_4_ = fVar151 * fStack_514 + fVar201 * auVar161._4_4_;
    fStack_3a0 = fVar184 * fStack_510 + fVar202 * auVar161._8_4_;
    fStack_39c = fVar185 * fStack_50c + fVar203 * auVar161._12_4_;
    fVar293 = fVar76 * (local_518 + local_588 * 0.33333334) +
              fVar186 * (auVar161._0_4_ + auVar19._0_4_ * 0.33333334);
    fVar301 = fVar151 * (fStack_514 + fStack_584 * 0.33333334) +
              fVar201 * (auVar161._4_4_ + auVar19._4_4_ * 0.33333334);
    fVar302 = fVar184 * (fStack_510 + fStack_580 * 0.33333334) +
              fVar202 * (auVar161._8_4_ + auVar19._8_4_ * 0.33333334);
    fVar303 = fVar185 * (fStack_50c + fStack_57c * 0.33333334) +
              fVar203 * (auVar161._12_4_ + auVar19._12_4_ * 0.33333334);
    local_558 = auVar131._0_4_;
    fStack_554 = auVar131._4_4_;
    fStack_550 = auVar131._8_4_;
    fStack_54c = auVar131._12_4_;
    auVar195._0_4_ = local_558 * 0.33333334;
    auVar195._4_4_ = fStack_554 * 0.33333334;
    auVar195._8_4_ = fStack_550 * 0.33333334;
    auVar195._12_4_ = fStack_54c * 0.33333334;
    auVar96 = vsubps_avx(auVar143,auVar195);
    auVar241._0_4_ = (fVar344 + auVar85._0_4_) * 0.33333334;
    auVar241._4_4_ = (fVar348 + auVar85._4_4_) * 0.33333334;
    auVar241._8_4_ = (fVar349 + auVar85._8_4_) * 0.33333334;
    auVar241._12_4_ = (fVar350 + auVar85._12_4_) * 0.33333334;
    auVar194 = vsubps_avx(_local_458,auVar241);
    auVar163._0_4_ = auVar18._0_4_ * 0.33333334;
    auVar163._4_4_ = auVar18._4_4_ * 0.33333334;
    auVar163._8_4_ = auVar18._8_4_ * 0.33333334;
    auVar163._12_4_ = auVar18._12_4_ * 0.33333334;
    auVar18 = vsubps_avx(auVar181,auVar163);
    auVar127._0_4_ = (fVar233 + auVar126._0_4_) * 0.33333334;
    auVar127._4_4_ = (fVar250 + auVar126._4_4_) * 0.33333334;
    auVar127._8_4_ = (fVar251 + auVar126._8_4_) * 0.33333334;
    auVar127._12_4_ = (fVar252 + auVar126._12_4_) * 0.33333334;
    auVar161 = vsubps_avx(auVar346,auVar127);
    local_3b8._0_4_ = fVar76 * auVar96._0_4_ + fVar186 * auVar18._0_4_;
    local_3b8._4_4_ = fVar151 * auVar96._4_4_ + fVar201 * auVar18._4_4_;
    fStack_3b0 = fVar184 * auVar96._8_4_ + fVar202 * auVar18._8_4_;
    fStack_3ac = fVar185 * auVar96._12_4_ + fVar203 * auVar18._12_4_;
    local_3c8._0_4_ = fVar186 * auVar181._0_4_ + auVar143._0_4_ * fVar76;
    local_3c8._4_4_ = fVar201 * auVar181._4_4_ + auVar143._4_4_ * fVar151;
    fStack_3c0 = fVar202 * auVar181._8_4_ + auVar143._8_4_ * fVar184;
    fStack_3bc = fVar203 * auVar181._12_4_ + auVar143._12_4_ * fVar185;
    local_3d8._0_4_ = fVar76 * (float)local_5f8._0_4_ + fVar186 * (auVar334._0_4_ + auVar214._0_4_);
    local_3d8._4_4_ = fVar151 * (float)local_5f8._4_4_ + fVar201 * (auVar334._4_4_ + auVar214._4_4_)
    ;
    fStack_3d0 = fVar184 * fStack_5f0 + fVar202 * (auVar334._8_4_ + auVar214._8_4_);
    fStack_3cc = fVar185 * fStack_5ec + fVar203 * (auVar334._12_4_ + auVar214._12_4_);
    local_3e8._0_4_ =
         fVar76 * ((float)local_5f8._0_4_ + (fVar75 + auVar271._0_4_) * 0.33333334) +
         fVar186 * (auVar334._0_4_ + auVar214._0_4_ + (fVar204 + auVar162._0_4_) * 0.33333334);
    local_3e8._4_4_ =
         fVar151 * ((float)local_5f8._4_4_ + (fVar115 + auVar271._4_4_) * 0.33333334) +
         fVar201 * (auVar334._4_4_ + auVar214._4_4_ + (fVar229 + auVar162._4_4_) * 0.33333334);
    fStack_3e0 = fVar184 * (fStack_5f0 + (fVar116 + auVar271._8_4_) * 0.33333334) +
                 fVar202 * (auVar334._8_4_ + auVar214._8_4_ +
                           (fVar230 + auVar162._8_4_) * 0.33333334);
    fStack_3dc = fVar185 * (fStack_5ec + (fVar117 + auVar271._12_4_) * 0.33333334) +
                 fVar203 * (auVar334._12_4_ + auVar214._12_4_ +
                           (fVar231 + auVar162._12_4_) * 0.33333334);
    local_318._0_4_ = fVar76 * auVar194._0_4_ + fVar186 * auVar161._0_4_;
    local_318._4_4_ = fVar151 * auVar194._4_4_ + fVar201 * auVar161._4_4_;
    fStack_310 = fVar184 * auVar194._8_4_ + fVar202 * auVar161._8_4_;
    fStack_30c = fVar185 * auVar194._12_4_ + fVar203 * auVar161._12_4_;
    auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    fVar233 = (auVar256._0_4_ + auVar156._0_4_) * fVar76 + fVar186 * auVar346._0_4_;
    fVar252 = (auVar256._4_4_ + auVar156._4_4_) * fVar151 + fVar201 * auVar346._4_4_;
    fVar115 = (auVar256._8_4_ + auVar156._8_4_) * fVar184 + fVar202 * auVar346._8_4_;
    fVar116 = (auVar256._12_4_ + auVar156._12_4_) * fVar185 + fVar203 * auVar346._12_4_;
    local_288 = vsubps_avx(_local_3a8,auVar96);
    auVar181 = vmovsldup_avx(local_288);
    auVar194 = vmovshdup_avx(local_288);
    auVar18 = vshufps_avx(local_288,local_288,0xaa);
    fVar76 = (local_428->vx).field_0.m128[0];
    fVar151 = (local_428->vx).field_0.m128[1];
    fVar184 = (local_428->vx).field_0.m128[2];
    fVar185 = (local_428->vx).field_0.m128[3];
    fVar186 = (local_428->vy).field_0.m128[0];
    fVar201 = (local_428->vy).field_0.m128[1];
    fVar202 = (local_428->vy).field_0.m128[2];
    fVar203 = (local_428->vy).field_0.m128[3];
    fVar204 = (local_428->vz).field_0.m128[0];
    fVar229 = (local_428->vz).field_0.m128[1];
    fVar230 = (local_428->vz).field_0.m128[2];
    fVar231 = (local_428->vz).field_0.m128[3];
    fVar250 = fVar76 * auVar181._0_4_ + fVar186 * auVar194._0_4_ + fVar204 * auVar18._0_4_;
    fVar232 = fVar151 * auVar181._4_4_ + fVar201 * auVar194._4_4_ + fVar229 * auVar18._4_4_;
    local_5d8._4_4_ = fVar232;
    local_5d8._0_4_ = fVar250;
    fStack_5d0 = fVar184 * auVar181._8_4_ + fVar202 * auVar194._8_4_ + fVar230 * auVar18._8_4_;
    fStack_5cc = fVar185 * auVar181._12_4_ + fVar203 * auVar194._12_4_ + fVar231 * auVar18._12_4_;
    auVar63._4_4_ = fVar301;
    auVar63._0_4_ = fVar293;
    auVar63._8_4_ = fVar302;
    auVar63._12_4_ = fVar303;
    local_298 = vsubps_avx(auVar63,auVar96);
    auVar18 = vshufps_avx(local_298,local_298,0xaa);
    auVar194 = vmovshdup_avx(local_298);
    auVar181 = vmovsldup_avx(local_298);
    fVar251 = fVar76 * auVar181._0_4_ + fVar186 * auVar194._0_4_ + fVar204 * auVar18._0_4_;
    fVar75 = fVar151 * auVar181._4_4_ + fVar201 * auVar194._4_4_ + fVar229 * auVar18._4_4_;
    local_5f8._4_4_ = fVar75;
    local_5f8._0_4_ = fVar251;
    fStack_5f0 = fVar184 * auVar181._8_4_ + fVar202 * auVar194._8_4_ + fVar230 * auVar18._8_4_;
    fStack_5ec = fVar185 * auVar181._12_4_ + fVar203 * auVar194._12_4_ + fVar231 * auVar18._12_4_;
    local_2a8 = vsubps_avx(_local_3b8,auVar96);
    auVar18 = vshufps_avx(local_2a8,local_2a8,0xaa);
    auVar194 = vmovshdup_avx(local_2a8);
    auVar181 = vmovsldup_avx(local_2a8);
    auVar215._0_4_ = fVar76 * auVar181._0_4_ + fVar186 * auVar194._0_4_ + fVar204 * auVar18._0_4_;
    auVar215._4_4_ = fVar151 * auVar181._4_4_ + fVar201 * auVar194._4_4_ + fVar229 * auVar18._4_4_;
    auVar215._8_4_ = fVar184 * auVar181._8_4_ + fVar202 * auVar194._8_4_ + fVar230 * auVar18._8_4_;
    auVar215._12_4_ =
         fVar185 * auVar181._12_4_ + fVar203 * auVar194._12_4_ + fVar231 * auVar18._12_4_;
    local_2b8 = vsubps_avx(_local_3c8,auVar96);
    auVar18 = vshufps_avx(local_2b8,local_2b8,0xaa);
    auVar194 = vmovshdup_avx(local_2b8);
    auVar181 = vmovsldup_avx(local_2b8);
    auVar128._0_4_ = auVar181._0_4_ * fVar76 + auVar194._0_4_ * fVar186 + fVar204 * auVar18._0_4_;
    auVar128._4_4_ = auVar181._4_4_ * fVar151 + auVar194._4_4_ * fVar201 + fVar229 * auVar18._4_4_;
    auVar128._8_4_ = auVar181._8_4_ * fVar184 + auVar194._8_4_ * fVar202 + fVar230 * auVar18._8_4_;
    auVar128._12_4_ =
         auVar181._12_4_ * fVar185 + auVar194._12_4_ * fVar203 + fVar231 * auVar18._12_4_;
    local_2c8 = vsubps_avx(_local_3d8,auVar96);
    auVar18 = vshufps_avx(local_2c8,local_2c8,0xaa);
    auVar194 = vmovshdup_avx(local_2c8);
    auVar181 = vmovsldup_avx(local_2c8);
    auVar289._0_4_ = auVar181._0_4_ * fVar76 + auVar194._0_4_ * fVar186 + auVar18._0_4_ * fVar204;
    auVar289._4_4_ = auVar181._4_4_ * fVar151 + auVar194._4_4_ * fVar201 + auVar18._4_4_ * fVar229;
    auVar289._8_4_ = auVar181._8_4_ * fVar184 + auVar194._8_4_ * fVar202 + auVar18._8_4_ * fVar230;
    auVar289._12_4_ =
         auVar181._12_4_ * fVar185 + auVar194._12_4_ * fVar203 + auVar18._12_4_ * fVar231;
    local_2d8 = vsubps_avx(_local_3e8,auVar96);
    auVar18 = vshufps_avx(local_2d8,local_2d8,0xaa);
    auVar194 = vmovshdup_avx(local_2d8);
    auVar181 = vmovsldup_avx(local_2d8);
    auVar295._0_4_ = auVar181._0_4_ * fVar76 + auVar194._0_4_ * fVar186 + auVar18._0_4_ * fVar204;
    auVar295._4_4_ = auVar181._4_4_ * fVar151 + auVar194._4_4_ * fVar201 + auVar18._4_4_ * fVar229;
    auVar295._8_4_ = auVar181._8_4_ * fVar184 + auVar194._8_4_ * fVar202 + auVar18._8_4_ * fVar230;
    auVar295._12_4_ =
         auVar181._12_4_ * fVar185 + auVar194._12_4_ * fVar203 + auVar18._12_4_ * fVar231;
    local_2e8 = vsubps_avx(_local_318,auVar96);
    auVar18 = vshufps_avx(local_2e8,local_2e8,0xaa);
    auVar194 = vmovshdup_avx(local_2e8);
    auVar181 = vmovsldup_avx(local_2e8);
    auVar310._0_4_ = auVar181._0_4_ * fVar76 + auVar194._0_4_ * fVar186 + auVar18._0_4_ * fVar204;
    auVar310._4_4_ = auVar181._4_4_ * fVar151 + auVar194._4_4_ * fVar201 + auVar18._4_4_ * fVar229;
    auVar310._8_4_ = auVar181._8_4_ * fVar184 + auVar194._8_4_ * fVar202 + auVar18._8_4_ * fVar230;
    auVar310._12_4_ =
         auVar181._12_4_ * fVar185 + auVar194._12_4_ * fVar203 + auVar18._12_4_ * fVar231;
    auVar61._4_4_ = fVar252;
    auVar61._0_4_ = fVar233;
    auVar61._8_4_ = fVar115;
    auVar61._12_4_ = fVar116;
    local_2f8 = vsubps_avx(auVar61,auVar96);
    auVar181 = vshufps_avx(local_2f8,local_2f8,0xaa);
    auVar96 = vmovshdup_avx(local_2f8);
    auVar194 = vmovsldup_avx(local_2f8);
    auVar91._0_4_ = fVar76 * auVar194._0_4_ + fVar186 * auVar96._0_4_ + fVar204 * auVar181._0_4_;
    auVar91._4_4_ = fVar151 * auVar194._4_4_ + fVar201 * auVar96._4_4_ + fVar229 * auVar181._4_4_;
    auVar91._8_4_ = fVar184 * auVar194._8_4_ + fVar202 * auVar96._8_4_ + fVar230 * auVar181._8_4_;
    auVar91._12_4_ =
         fVar185 * auVar194._12_4_ + fVar203 * auVar96._12_4_ + fVar231 * auVar181._12_4_;
    auVar18 = vmovlhps_avx(_local_5d8,auVar289);
    auVar161 = vmovlhps_avx(_local_5f8,auVar295);
    auVar19 = vmovlhps_avx(auVar215,auVar310);
    auVar20 = vmovlhps_avx(auVar128,auVar91);
    auVar96 = vminps_avx(auVar18,auVar161);
    auVar194 = vminps_avx(auVar19,auVar20);
    auVar181 = vminps_avx(auVar96,auVar194);
    auVar96 = vmaxps_avx(auVar18,auVar161);
    auVar194 = vmaxps_avx(auVar19,auVar20);
    auVar96 = vmaxps_avx(auVar96,auVar194);
    auVar194 = vshufpd_avx(auVar181,auVar181,3);
    auVar181 = vminps_avx(auVar181,auVar194);
    auVar194 = vshufpd_avx(auVar96,auVar96,3);
    auVar194 = vmaxps_avx(auVar96,auVar194);
    auVar257._8_4_ = 0x7fffffff;
    auVar257._0_8_ = 0x7fffffff7fffffff;
    auVar257._12_4_ = 0x7fffffff;
    auVar96 = vandps_avx(auVar181,auVar257);
    auVar194 = vandps_avx(auVar194,auVar257);
    auVar96 = vmaxps_avx(auVar96,auVar194);
    auVar194 = vmovshdup_avx(auVar96);
    auVar96 = vmaxss_avx(auVar194,auVar96);
    fVar151 = auVar96._0_4_ * 9.536743e-07;
    auVar96 = vshufps_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar151),0);
    local_228._16_16_ = auVar96;
    local_228._0_16_ = auVar96;
    auVar92._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
    auVar92._8_4_ = auVar96._8_4_ ^ 0x80000000;
    auVar92._12_4_ = auVar96._12_4_ ^ 0x80000000;
    local_248._16_16_ = auVar92;
    local_248._0_16_ = auVar92;
    local_378 = vpshufd_avx(ZEXT416(uVar67),0);
    local_388 = vpshufd_avx(ZEXT416(uVar11),0);
    uVar74 = 0;
    fVar76 = *(float *)(ray + k * 4 + 0x30);
    _local_258 = vsubps_avx(auVar161,auVar18);
    _local_268 = vsubps_avx(auVar19,auVar161);
    _local_278 = vsubps_avx(auVar20,auVar19);
    _local_328 = vsubps_avx(_local_3d8,_local_3a8);
    auVar64._4_4_ = fVar301;
    auVar64._0_4_ = fVar293;
    auVar64._8_4_ = fVar302;
    auVar64._12_4_ = fVar303;
    _local_338 = vsubps_avx(_local_3e8,auVar64);
    _local_348 = vsubps_avx(_local_318,_local_3b8);
    auVar62._4_4_ = fVar252;
    auVar62._0_4_ = fVar233;
    auVar62._8_4_ = fVar115;
    auVar62._12_4_ = fVar116;
    _local_358 = vsubps_avx(auVar62,_local_3c8);
    auVar324 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar362 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00f2604b:
    auVar118 = auVar362._0_16_;
    local_308 = auVar118;
    auVar79 = auVar324._0_16_;
    auVar96 = vshufps_avx(auVar79,auVar79,0x50);
    auVar355._8_4_ = 0x3f800000;
    auVar355._0_8_ = 0x3f8000003f800000;
    auVar355._12_4_ = 0x3f800000;
    auVar358._16_4_ = 0x3f800000;
    auVar358._0_16_ = auVar355;
    auVar358._20_4_ = 0x3f800000;
    auVar358._24_4_ = 0x3f800000;
    auVar358._28_4_ = 0x3f800000;
    auVar194 = vsubps_avx(auVar355,auVar96);
    fVar184 = auVar96._0_4_;
    fVar185 = auVar96._4_4_;
    fVar186 = auVar96._8_4_;
    fVar201 = auVar96._12_4_;
    fVar202 = auVar194._0_4_;
    fVar203 = auVar194._4_4_;
    fVar204 = auVar194._8_4_;
    fVar229 = auVar194._12_4_;
    auVar196._0_4_ = auVar289._0_4_ * fVar184 + fVar202 * fVar250;
    auVar196._4_4_ = auVar289._4_4_ * fVar185 + fVar203 * fVar232;
    auVar196._8_4_ = auVar289._0_4_ * fVar186 + fVar204 * fVar250;
    auVar196._12_4_ = auVar289._4_4_ * fVar201 + fVar229 * fVar232;
    auVar164._0_4_ = auVar295._0_4_ * fVar184 + fVar202 * fVar251;
    auVar164._4_4_ = auVar295._4_4_ * fVar185 + fVar203 * fVar75;
    auVar164._8_4_ = auVar295._0_4_ * fVar186 + fVar204 * fVar251;
    auVar164._12_4_ = auVar295._4_4_ * fVar201 + fVar229 * fVar75;
    auVar272._0_4_ = auVar310._0_4_ * fVar184 + auVar215._0_4_ * fVar202;
    auVar272._4_4_ = auVar310._4_4_ * fVar185 + auVar215._4_4_ * fVar203;
    auVar272._8_4_ = auVar310._0_4_ * fVar186 + auVar215._0_4_ * fVar204;
    auVar272._12_4_ = auVar310._4_4_ * fVar201 + auVar215._4_4_ * fVar229;
    auVar216._0_4_ = auVar91._0_4_ * fVar184 + auVar128._0_4_ * fVar202;
    auVar216._4_4_ = auVar91._4_4_ * fVar185 + auVar128._4_4_ * fVar203;
    auVar216._8_4_ = auVar91._0_4_ * fVar186 + auVar128._0_4_ * fVar204;
    auVar216._12_4_ = auVar91._4_4_ * fVar201 + auVar128._4_4_ * fVar229;
    auVar96 = vmovshdup_avx(auVar118);
    auVar194 = vshufps_avx(auVar118,auVar118,0);
    auVar299._16_16_ = auVar194;
    auVar299._0_16_ = auVar194;
    auVar181 = vshufps_avx(auVar118,auVar118,0x55);
    auVar110._16_16_ = auVar181;
    auVar110._0_16_ = auVar181;
    auVar109 = vsubps_avx(auVar110,auVar299);
    auVar181 = vshufps_avx(auVar196,auVar196,0);
    auVar143 = vshufps_avx(auVar196,auVar196,0x55);
    auVar131 = vshufps_avx(auVar164,auVar164,0);
    auVar167 = vshufps_avx(auVar164,auVar164,0x55);
    auVar132 = vshufps_avx(auVar272,auVar272,0);
    auVar264 = vshufps_avx(auVar272,auVar272,0x55);
    auVar77 = vshufps_avx(auVar216,auVar216,0);
    auVar78 = vshufps_avx(auVar216,auVar216,0x55);
    auVar96 = ZEXT416((uint)((auVar96._0_4_ - auVar362._0_4_) * 0.04761905));
    auVar96 = vshufps_avx(auVar96,auVar96,0);
    auVar314._0_4_ = auVar194._0_4_ + auVar109._0_4_ * 0.0;
    auVar314._4_4_ = auVar194._4_4_ + auVar109._4_4_ * 0.14285715;
    auVar314._8_4_ = auVar194._8_4_ + auVar109._8_4_ * 0.2857143;
    auVar314._12_4_ = auVar194._12_4_ + auVar109._12_4_ * 0.42857146;
    auVar314._16_4_ = auVar194._0_4_ + auVar109._16_4_ * 0.5714286;
    auVar314._20_4_ = auVar194._4_4_ + auVar109._20_4_ * 0.71428573;
    auVar314._24_4_ = auVar194._8_4_ + auVar109._24_4_ * 0.8571429;
    auVar314._28_4_ = auVar194._12_4_ + auVar109._28_4_;
    auVar21 = vsubps_avx(auVar358,auVar314);
    fVar184 = auVar131._0_4_;
    fVar186 = auVar131._4_4_;
    fVar202 = auVar131._8_4_;
    fVar204 = auVar131._12_4_;
    fVar363 = auVar21._0_4_;
    fVar364 = auVar21._4_4_;
    fVar366 = auVar21._8_4_;
    fVar304 = auVar21._12_4_;
    fVar305 = auVar21._16_4_;
    fVar306 = auVar21._20_4_;
    fVar307 = auVar21._24_4_;
    fVar348 = auVar167._0_4_;
    fVar350 = auVar167._4_4_;
    fVar326 = auVar167._8_4_;
    fVar330 = auVar167._12_4_;
    fVar351 = auVar143._12_4_ + 1.0;
    fVar337 = auVar132._0_4_;
    fVar338 = auVar132._4_4_;
    fVar339 = auVar132._8_4_;
    fVar344 = auVar132._12_4_;
    fVar230 = fVar337 * auVar314._0_4_ + fVar363 * fVar184;
    fVar231 = fVar338 * auVar314._4_4_ + fVar364 * fVar186;
    fVar117 = fVar339 * auVar314._8_4_ + fVar366 * fVar202;
    fVar315 = fVar344 * auVar314._12_4_ + fVar304 * fVar204;
    fVar325 = fVar337 * auVar314._16_4_ + fVar305 * fVar184;
    fVar327 = fVar338 * auVar314._20_4_ + fVar306 * fVar186;
    fVar329 = fVar339 * auVar314._24_4_ + fVar307 * fVar202;
    fVar185 = auVar264._0_4_;
    fVar201 = auVar264._4_4_;
    fVar203 = auVar264._8_4_;
    fVar229 = auVar264._12_4_;
    fVar349 = fVar348 * fVar363 + auVar314._0_4_ * fVar185;
    fVar316 = fVar350 * fVar364 + auVar314._4_4_ * fVar201;
    fVar328 = fVar326 * fVar366 + auVar314._8_4_ * fVar203;
    fVar359 = fVar330 * fVar304 + auVar314._12_4_ * fVar229;
    fVar340 = fVar348 * fVar305 + auVar314._16_4_ * fVar185;
    fVar341 = fVar350 * fVar306 + auVar314._20_4_ * fVar201;
    fVar342 = fVar326 * fVar307 + auVar314._24_4_ * fVar203;
    fVar343 = fVar330 + fVar204;
    auVar194 = vshufps_avx(auVar196,auVar196,0xaa);
    auVar131 = vshufps_avx(auVar196,auVar196,0xff);
    fVar331 = fVar344 + 0.0;
    auVar167 = vshufps_avx(auVar164,auVar164,0xaa);
    auVar132 = vshufps_avx(auVar164,auVar164,0xff);
    auVar227._0_4_ =
         fVar363 * (auVar314._0_4_ * fVar184 + fVar363 * auVar181._0_4_) + auVar314._0_4_ * fVar230;
    auVar227._4_4_ =
         fVar364 * (auVar314._4_4_ * fVar186 + fVar364 * auVar181._4_4_) + auVar314._4_4_ * fVar231;
    auVar227._8_4_ =
         fVar366 * (auVar314._8_4_ * fVar202 + fVar366 * auVar181._8_4_) + auVar314._8_4_ * fVar117;
    auVar227._12_4_ =
         fVar304 * (auVar314._12_4_ * fVar204 + fVar304 * auVar181._12_4_) +
         auVar314._12_4_ * fVar315;
    auVar227._16_4_ =
         fVar305 * (auVar314._16_4_ * fVar184 + fVar305 * auVar181._0_4_) +
         auVar314._16_4_ * fVar325;
    auVar227._20_4_ =
         fVar306 * (auVar314._20_4_ * fVar186 + fVar306 * auVar181._4_4_) +
         auVar314._20_4_ * fVar327;
    auVar227._24_4_ =
         fVar307 * (auVar314._24_4_ * fVar202 + fVar307 * auVar181._8_4_) +
         auVar314._24_4_ * fVar329;
    auVar227._28_4_ = auVar181._12_4_ + 1.0 + fVar229;
    auVar248._0_4_ =
         fVar363 * (fVar348 * auVar314._0_4_ + auVar143._0_4_ * fVar363) + auVar314._0_4_ * fVar349;
    auVar248._4_4_ =
         fVar364 * (fVar350 * auVar314._4_4_ + auVar143._4_4_ * fVar364) + auVar314._4_4_ * fVar316;
    auVar248._8_4_ =
         fVar366 * (fVar326 * auVar314._8_4_ + auVar143._8_4_ * fVar366) + auVar314._8_4_ * fVar328;
    auVar248._12_4_ =
         fVar304 * (fVar330 * auVar314._12_4_ + auVar143._12_4_ * fVar304) +
         auVar314._12_4_ * fVar359;
    auVar248._16_4_ =
         fVar305 * (fVar348 * auVar314._16_4_ + auVar143._0_4_ * fVar305) +
         auVar314._16_4_ * fVar340;
    auVar248._20_4_ =
         fVar306 * (fVar350 * auVar314._20_4_ + auVar143._4_4_ * fVar306) +
         auVar314._20_4_ * fVar341;
    auVar248._24_4_ =
         fVar307 * (fVar326 * auVar314._24_4_ + auVar143._8_4_ * fVar307) +
         auVar314._24_4_ * fVar342;
    auVar248._28_4_ = auVar78._12_4_ + fVar229;
    auVar111._0_4_ =
         fVar363 * fVar230 + auVar314._0_4_ * (fVar337 * fVar363 + auVar77._0_4_ * auVar314._0_4_);
    auVar111._4_4_ =
         fVar364 * fVar231 + auVar314._4_4_ * (fVar338 * fVar364 + auVar77._4_4_ * auVar314._4_4_);
    auVar111._8_4_ =
         fVar366 * fVar117 + auVar314._8_4_ * (fVar339 * fVar366 + auVar77._8_4_ * auVar314._8_4_);
    auVar111._12_4_ =
         fVar304 * fVar315 +
         auVar314._12_4_ * (fVar344 * fVar304 + auVar77._12_4_ * auVar314._12_4_);
    auVar111._16_4_ =
         fVar305 * fVar325 + auVar314._16_4_ * (fVar337 * fVar305 + auVar77._0_4_ * auVar314._16_4_)
    ;
    auVar111._20_4_ =
         fVar306 * fVar327 + auVar314._20_4_ * (fVar338 * fVar306 + auVar77._4_4_ * auVar314._20_4_)
    ;
    auVar111._24_4_ =
         fVar307 * fVar329 + auVar314._24_4_ * (fVar339 * fVar307 + auVar77._8_4_ * auVar314._24_4_)
    ;
    auVar111._28_4_ = fVar204 + 1.0 + fVar331;
    auVar323._0_4_ =
         fVar363 * fVar349 + auVar314._0_4_ * (auVar78._0_4_ * auVar314._0_4_ + fVar363 * fVar185);
    auVar323._4_4_ =
         fVar364 * fVar316 + auVar314._4_4_ * (auVar78._4_4_ * auVar314._4_4_ + fVar364 * fVar201);
    auVar323._8_4_ =
         fVar366 * fVar328 + auVar314._8_4_ * (auVar78._8_4_ * auVar314._8_4_ + fVar366 * fVar203);
    auVar323._12_4_ =
         fVar304 * fVar359 +
         auVar314._12_4_ * (auVar78._12_4_ * auVar314._12_4_ + fVar304 * fVar229);
    auVar323._16_4_ =
         fVar305 * fVar340 + auVar314._16_4_ * (auVar78._0_4_ * auVar314._16_4_ + fVar305 * fVar185)
    ;
    auVar323._20_4_ =
         fVar306 * fVar341 + auVar314._20_4_ * (auVar78._4_4_ * auVar314._20_4_ + fVar306 * fVar201)
    ;
    auVar323._24_4_ =
         fVar307 * fVar342 + auVar314._24_4_ * (auVar78._8_4_ * auVar314._24_4_ + fVar307 * fVar203)
    ;
    auVar323._28_4_ = fVar331 + fVar229 + 0.0;
    local_98._0_4_ = fVar363 * auVar227._0_4_ + auVar314._0_4_ * auVar111._0_4_;
    local_98._4_4_ = fVar364 * auVar227._4_4_ + auVar314._4_4_ * auVar111._4_4_;
    local_98._8_4_ = fVar366 * auVar227._8_4_ + auVar314._8_4_ * auVar111._8_4_;
    local_98._12_4_ = fVar304 * auVar227._12_4_ + auVar314._12_4_ * auVar111._12_4_;
    local_98._16_4_ = fVar305 * auVar227._16_4_ + auVar314._16_4_ * auVar111._16_4_;
    local_98._20_4_ = fVar306 * auVar227._20_4_ + auVar314._20_4_ * auVar111._20_4_;
    local_98._24_4_ = fVar307 * auVar227._24_4_ + auVar314._24_4_ * auVar111._24_4_;
    local_98._28_4_ = fVar343 + fVar229 + 0.0;
    auVar200._0_4_ = fVar363 * auVar248._0_4_ + auVar314._0_4_ * auVar323._0_4_;
    auVar200._4_4_ = fVar364 * auVar248._4_4_ + auVar314._4_4_ * auVar323._4_4_;
    auVar200._8_4_ = fVar366 * auVar248._8_4_ + auVar314._8_4_ * auVar323._8_4_;
    auVar200._12_4_ = fVar304 * auVar248._12_4_ + auVar314._12_4_ * auVar323._12_4_;
    auVar200._16_4_ = fVar305 * auVar248._16_4_ + auVar314._16_4_ * auVar323._16_4_;
    auVar200._20_4_ = fVar306 * auVar248._20_4_ + auVar314._20_4_ * auVar323._20_4_;
    auVar200._24_4_ = fVar307 * auVar248._24_4_ + auVar314._24_4_ * auVar323._24_4_;
    auVar200._28_4_ = fVar343 + fVar331;
    auVar22 = vsubps_avx(auVar111,auVar227);
    auVar109 = vsubps_avx(auVar323,auVar248);
    local_538 = auVar96._0_4_;
    fStack_534 = auVar96._4_4_;
    fStack_530 = auVar96._8_4_;
    fStack_52c = auVar96._12_4_;
    local_d8 = local_538 * auVar22._0_4_ * 3.0;
    fStack_d4 = fStack_534 * auVar22._4_4_ * 3.0;
    auVar23._4_4_ = fStack_d4;
    auVar23._0_4_ = local_d8;
    fStack_d0 = fStack_530 * auVar22._8_4_ * 3.0;
    auVar23._8_4_ = fStack_d0;
    fStack_cc = fStack_52c * auVar22._12_4_ * 3.0;
    auVar23._12_4_ = fStack_cc;
    fStack_c8 = local_538 * auVar22._16_4_ * 3.0;
    auVar23._16_4_ = fStack_c8;
    fStack_c4 = fStack_534 * auVar22._20_4_ * 3.0;
    auVar23._20_4_ = fStack_c4;
    fStack_c0 = fStack_530 * auVar22._24_4_ * 3.0;
    auVar23._24_4_ = fStack_c0;
    auVar23._28_4_ = auVar22._28_4_;
    local_f8 = local_538 * auVar109._0_4_ * 3.0;
    fStack_f4 = fStack_534 * auVar109._4_4_ * 3.0;
    auVar24._4_4_ = fStack_f4;
    auVar24._0_4_ = local_f8;
    fStack_f0 = fStack_530 * auVar109._8_4_ * 3.0;
    auVar24._8_4_ = fStack_f0;
    fStack_ec = fStack_52c * auVar109._12_4_ * 3.0;
    auVar24._12_4_ = fStack_ec;
    fStack_e8 = local_538 * auVar109._16_4_ * 3.0;
    auVar24._16_4_ = fStack_e8;
    fStack_e4 = fStack_534 * auVar109._20_4_ * 3.0;
    auVar24._20_4_ = fStack_e4;
    fStack_e0 = fStack_530 * auVar109._24_4_ * 3.0;
    auVar24._24_4_ = fStack_e0;
    auVar24._28_4_ = fVar343;
    auVar23 = vsubps_avx(local_98,auVar23);
    auVar109 = vperm2f128_avx(auVar23,auVar23,1);
    auVar109 = vshufps_avx(auVar109,auVar23,0x30);
    auVar109 = vshufps_avx(auVar23,auVar109,0x29);
    auVar24 = vsubps_avx(auVar200,auVar24);
    auVar23 = vperm2f128_avx(auVar24,auVar24,1);
    auVar23 = vshufps_avx(auVar23,auVar24,0x30);
    auVar24 = vshufps_avx(auVar24,auVar23,0x29);
    fVar341 = auVar167._0_4_;
    fVar342 = auVar167._4_4_;
    fVar365 = auVar167._8_4_;
    fVar204 = auVar194._12_4_;
    fVar338 = auVar132._0_4_;
    fVar344 = auVar132._4_4_;
    fVar349 = auVar132._8_4_;
    fVar316 = auVar132._12_4_;
    auVar96 = vshufps_avx(auVar272,auVar272,0xaa);
    fVar184 = auVar96._0_4_;
    fVar186 = auVar96._4_4_;
    fVar202 = auVar96._8_4_;
    fVar229 = auVar96._12_4_;
    fVar117 = auVar314._0_4_ * fVar184 + fVar341 * fVar363;
    fVar315 = auVar314._4_4_ * fVar186 + fVar342 * fVar364;
    fVar325 = auVar314._8_4_ * fVar202 + fVar365 * fVar366;
    fVar327 = auVar314._12_4_ * fVar229 + auVar167._12_4_ * fVar304;
    fVar329 = auVar314._16_4_ * fVar184 + fVar341 * fVar305;
    fVar331 = auVar314._20_4_ * fVar186 + fVar342 * fVar306;
    fVar337 = auVar314._24_4_ * fVar202 + fVar365 * fVar307;
    auVar96 = vshufps_avx(auVar272,auVar272,0xff);
    fVar185 = auVar96._0_4_;
    fVar201 = auVar96._4_4_;
    fVar203 = auVar96._8_4_;
    fVar230 = auVar96._12_4_;
    fVar339 = auVar314._0_4_ * fVar185 + fVar338 * fVar363;
    fVar348 = auVar314._4_4_ * fVar201 + fVar344 * fVar364;
    fVar350 = auVar314._8_4_ * fVar203 + fVar349 * fVar366;
    fVar326 = auVar314._12_4_ * fVar230 + fVar316 * fVar304;
    fVar328 = auVar314._16_4_ * fVar185 + fVar338 * fVar305;
    fVar330 = auVar314._20_4_ * fVar201 + fVar344 * fVar306;
    fVar359 = auVar314._24_4_ * fVar203 + fVar349 * fVar307;
    auVar96 = vshufps_avx(auVar216,auVar216,0xaa);
    fVar340 = auVar96._12_4_ + fVar229;
    auVar181 = vshufps_avx(auVar216,auVar216,0xff);
    fVar231 = auVar181._12_4_;
    auVar112._0_4_ =
         fVar363 * (fVar341 * auVar314._0_4_ + fVar363 * auVar194._0_4_) + auVar314._0_4_ * fVar117;
    auVar112._4_4_ =
         fVar364 * (fVar342 * auVar314._4_4_ + fVar364 * auVar194._4_4_) + auVar314._4_4_ * fVar315;
    auVar112._8_4_ =
         fVar366 * (fVar365 * auVar314._8_4_ + fVar366 * auVar194._8_4_) + auVar314._8_4_ * fVar325;
    auVar112._12_4_ =
         fVar304 * (auVar167._12_4_ * auVar314._12_4_ + fVar304 * fVar204) +
         auVar314._12_4_ * fVar327;
    auVar112._16_4_ =
         fVar305 * (fVar341 * auVar314._16_4_ + fVar305 * auVar194._0_4_) +
         auVar314._16_4_ * fVar329;
    auVar112._20_4_ =
         fVar306 * (fVar342 * auVar314._20_4_ + fVar306 * auVar194._4_4_) +
         auVar314._20_4_ * fVar331;
    auVar112._24_4_ =
         fVar307 * (fVar365 * auVar314._24_4_ + fVar307 * auVar194._8_4_) +
         auVar314._24_4_ * fVar337;
    auVar112._28_4_ = auVar24._28_4_ + fVar204 + fVar231;
    auVar147._0_4_ =
         fVar363 * (fVar338 * auVar314._0_4_ + auVar131._0_4_ * fVar363) + auVar314._0_4_ * fVar339;
    auVar147._4_4_ =
         fVar364 * (fVar344 * auVar314._4_4_ + auVar131._4_4_ * fVar364) + auVar314._4_4_ * fVar348;
    auVar147._8_4_ =
         fVar366 * (fVar349 * auVar314._8_4_ + auVar131._8_4_ * fVar366) + auVar314._8_4_ * fVar350;
    auVar147._12_4_ =
         fVar304 * (fVar316 * auVar314._12_4_ + auVar131._12_4_ * fVar304) +
         auVar314._12_4_ * fVar326;
    auVar147._16_4_ =
         fVar305 * (fVar338 * auVar314._16_4_ + auVar131._0_4_ * fVar305) +
         auVar314._16_4_ * fVar328;
    auVar147._20_4_ =
         fVar306 * (fVar344 * auVar314._20_4_ + auVar131._4_4_ * fVar306) +
         auVar314._20_4_ * fVar330;
    auVar147._24_4_ =
         fVar307 * (fVar349 * auVar314._24_4_ + auVar131._8_4_ * fVar307) +
         auVar314._24_4_ * fVar359;
    auVar147._28_4_ = fVar204 + auVar23._28_4_ + fVar231;
    auVar23 = vperm2f128_avx(local_98,local_98,1);
    auVar23 = vshufps_avx(auVar23,local_98,0x30);
    auVar110 = vshufps_avx(local_98,auVar23,0x29);
    auVar249._0_4_ =
         auVar314._0_4_ * (auVar96._0_4_ * auVar314._0_4_ + fVar363 * fVar184) + fVar363 * fVar117;
    auVar249._4_4_ =
         auVar314._4_4_ * (auVar96._4_4_ * auVar314._4_4_ + fVar364 * fVar186) + fVar364 * fVar315;
    auVar249._8_4_ =
         auVar314._8_4_ * (auVar96._8_4_ * auVar314._8_4_ + fVar366 * fVar202) + fVar366 * fVar325;
    auVar249._12_4_ =
         auVar314._12_4_ * (auVar96._12_4_ * auVar314._12_4_ + fVar304 * fVar229) +
         fVar304 * fVar327;
    auVar249._16_4_ =
         auVar314._16_4_ * (auVar96._0_4_ * auVar314._16_4_ + fVar305 * fVar184) + fVar305 * fVar329
    ;
    auVar249._20_4_ =
         auVar314._20_4_ * (auVar96._4_4_ * auVar314._20_4_ + fVar306 * fVar186) + fVar306 * fVar331
    ;
    auVar249._24_4_ =
         auVar314._24_4_ * (auVar96._8_4_ * auVar314._24_4_ + fVar307 * fVar202) + fVar307 * fVar337
    ;
    auVar249._28_4_ = fVar340 + fVar351 + auVar248._28_4_;
    auVar292._0_4_ =
         fVar363 * fVar339 + auVar314._0_4_ * (auVar314._0_4_ * auVar181._0_4_ + fVar363 * fVar185);
    auVar292._4_4_ =
         fVar364 * fVar348 + auVar314._4_4_ * (auVar314._4_4_ * auVar181._4_4_ + fVar364 * fVar201);
    auVar292._8_4_ =
         fVar366 * fVar350 + auVar314._8_4_ * (auVar314._8_4_ * auVar181._8_4_ + fVar366 * fVar203);
    auVar292._12_4_ =
         fVar304 * fVar326 + auVar314._12_4_ * (auVar314._12_4_ * fVar231 + fVar304 * fVar230);
    auVar292._16_4_ =
         fVar305 * fVar328 +
         auVar314._16_4_ * (auVar314._16_4_ * auVar181._0_4_ + fVar305 * fVar185);
    auVar292._20_4_ =
         fVar306 * fVar330 +
         auVar314._20_4_ * (auVar314._20_4_ * auVar181._4_4_ + fVar306 * fVar201);
    auVar292._24_4_ =
         fVar307 * fVar359 +
         auVar314._24_4_ * (auVar314._24_4_ * auVar181._8_4_ + fVar307 * fVar203);
    auVar292._28_4_ = fVar351 + fVar316 + fVar231 + fVar230;
    auVar275._0_4_ = fVar363 * auVar112._0_4_ + auVar314._0_4_ * auVar249._0_4_;
    auVar275._4_4_ = fVar364 * auVar112._4_4_ + auVar314._4_4_ * auVar249._4_4_;
    auVar275._8_4_ = fVar366 * auVar112._8_4_ + auVar314._8_4_ * auVar249._8_4_;
    auVar275._12_4_ = fVar304 * auVar112._12_4_ + auVar314._12_4_ * auVar249._12_4_;
    auVar275._16_4_ = fVar305 * auVar112._16_4_ + auVar314._16_4_ * auVar249._16_4_;
    auVar275._20_4_ = fVar306 * auVar112._20_4_ + auVar314._20_4_ * auVar249._20_4_;
    auVar275._24_4_ = fVar307 * auVar112._24_4_ + auVar314._24_4_ * auVar249._24_4_;
    auVar275._28_4_ = fVar340 + fVar231 + fVar230;
    auVar300._0_4_ = fVar363 * auVar147._0_4_ + auVar314._0_4_ * auVar292._0_4_;
    auVar300._4_4_ = fVar364 * auVar147._4_4_ + auVar314._4_4_ * auVar292._4_4_;
    auVar300._8_4_ = fVar366 * auVar147._8_4_ + auVar314._8_4_ * auVar292._8_4_;
    auVar300._12_4_ = fVar304 * auVar147._12_4_ + auVar314._12_4_ * auVar292._12_4_;
    auVar300._16_4_ = fVar305 * auVar147._16_4_ + auVar314._16_4_ * auVar292._16_4_;
    auVar300._20_4_ = fVar306 * auVar147._20_4_ + auVar314._20_4_ * auVar292._20_4_;
    auVar300._24_4_ = fVar307 * auVar147._24_4_ + auVar314._24_4_ * auVar292._24_4_;
    auVar300._28_4_ = auVar21._28_4_ + auVar314._28_4_;
    auVar25 = vsubps_avx(auVar249,auVar112);
    auVar23 = vsubps_avx(auVar292,auVar147);
    local_118 = local_538 * auVar25._0_4_ * 3.0;
    fStack_114 = fStack_534 * auVar25._4_4_ * 3.0;
    auVar21._4_4_ = fStack_114;
    auVar21._0_4_ = local_118;
    fStack_110 = fStack_530 * auVar25._8_4_ * 3.0;
    auVar21._8_4_ = fStack_110;
    fStack_10c = fStack_52c * auVar25._12_4_ * 3.0;
    auVar21._12_4_ = fStack_10c;
    fStack_108 = local_538 * auVar25._16_4_ * 3.0;
    auVar21._16_4_ = fStack_108;
    fStack_104 = fStack_534 * auVar25._20_4_ * 3.0;
    auVar21._20_4_ = fStack_104;
    fStack_100 = fStack_530 * auVar25._24_4_ * 3.0;
    auVar21._24_4_ = fStack_100;
    auVar21._28_4_ = auVar25._28_4_;
    local_138 = local_538 * auVar23._0_4_ * 3.0;
    fStack_134 = fStack_534 * auVar23._4_4_ * 3.0;
    auVar26._4_4_ = fStack_134;
    auVar26._0_4_ = local_138;
    fStack_130 = fStack_530 * auVar23._8_4_ * 3.0;
    auVar26._8_4_ = fStack_130;
    fStack_12c = fStack_52c * auVar23._12_4_ * 3.0;
    auVar26._12_4_ = fStack_12c;
    fStack_128 = local_538 * auVar23._16_4_ * 3.0;
    auVar26._16_4_ = fStack_128;
    fStack_124 = fStack_534 * auVar23._20_4_ * 3.0;
    auVar26._20_4_ = fStack_124;
    fStack_120 = fStack_530 * auVar23._24_4_ * 3.0;
    auVar26._24_4_ = fStack_120;
    auVar26._28_4_ = auVar249._28_4_;
    auVar23 = vperm2f128_avx(auVar275,auVar275,1);
    auVar23 = vshufps_avx(auVar23,auVar275,0x30);
    auVar111 = vshufps_avx(auVar275,auVar23,0x29);
    auVar21 = vsubps_avx(auVar275,auVar21);
    auVar23 = vperm2f128_avx(auVar21,auVar21,1);
    auVar23 = vshufps_avx(auVar23,auVar21,0x30);
    auVar23 = vshufps_avx(auVar21,auVar23,0x29);
    auVar26 = vsubps_avx(auVar300,auVar26);
    auVar21 = vperm2f128_avx(auVar26,auVar26,1);
    auVar21 = vshufps_avx(auVar21,auVar26,0x30);
    auVar26 = vshufps_avx(auVar26,auVar21,0x29);
    auVar27 = vsubps_avx(auVar275,local_98);
    auVar112 = vsubps_avx(auVar111,auVar110);
    fVar184 = auVar112._0_4_ + auVar27._0_4_;
    fVar185 = auVar112._4_4_ + auVar27._4_4_;
    fVar186 = auVar112._8_4_ + auVar27._8_4_;
    fVar201 = auVar112._12_4_ + auVar27._12_4_;
    fVar202 = auVar112._16_4_ + auVar27._16_4_;
    fVar203 = auVar112._20_4_ + auVar27._20_4_;
    fVar204 = auVar112._24_4_ + auVar27._24_4_;
    auVar21 = vperm2f128_avx(auVar200,auVar200,1);
    auVar21 = vshufps_avx(auVar21,auVar200,0x30);
    local_b8 = vshufps_avx(auVar200,auVar21,0x29);
    auVar21 = vperm2f128_avx(auVar300,auVar300,1);
    auVar21 = vshufps_avx(auVar21,auVar300,0x30);
    local_78 = vshufps_avx(auVar300,auVar21,0x29);
    auVar21 = vsubps_avx(auVar300,auVar200);
    auVar147 = vsubps_avx(local_78,local_b8);
    fVar229 = auVar147._0_4_ + auVar21._0_4_;
    fVar230 = auVar147._4_4_ + auVar21._4_4_;
    fVar231 = auVar147._8_4_ + auVar21._8_4_;
    fVar117 = auVar147._12_4_ + auVar21._12_4_;
    fVar315 = auVar147._16_4_ + auVar21._16_4_;
    fVar325 = auVar147._20_4_ + auVar21._20_4_;
    fVar327 = auVar147._24_4_ + auVar21._24_4_;
    auVar28._4_4_ = fVar185 * auVar200._4_4_;
    auVar28._0_4_ = fVar184 * auVar200._0_4_;
    auVar28._8_4_ = fVar186 * auVar200._8_4_;
    auVar28._12_4_ = fVar201 * auVar200._12_4_;
    auVar28._16_4_ = fVar202 * auVar200._16_4_;
    auVar28._20_4_ = fVar203 * auVar200._20_4_;
    auVar28._24_4_ = fVar204 * auVar200._24_4_;
    auVar28._28_4_ = auVar21._28_4_;
    auVar29._4_4_ = fVar230 * local_98._4_4_;
    auVar29._0_4_ = fVar229 * local_98._0_4_;
    auVar29._8_4_ = fVar231 * local_98._8_4_;
    auVar29._12_4_ = fVar117 * local_98._12_4_;
    auVar29._16_4_ = fVar315 * local_98._16_4_;
    auVar29._20_4_ = fVar325 * local_98._20_4_;
    auVar29._24_4_ = fVar327 * local_98._24_4_;
    auVar29._28_4_ = fVar340;
    auVar28 = vsubps_avx(auVar28,auVar29);
    local_d8 = local_98._0_4_ + local_d8;
    fStack_d4 = local_98._4_4_ + fStack_d4;
    fStack_d0 = local_98._8_4_ + fStack_d0;
    fStack_cc = local_98._12_4_ + fStack_cc;
    fStack_c8 = local_98._16_4_ + fStack_c8;
    fStack_c4 = local_98._20_4_ + fStack_c4;
    fStack_c0 = local_98._24_4_ + fStack_c0;
    fStack_bc = local_98._28_4_ + auVar22._28_4_;
    local_f8 = local_f8 + auVar200._0_4_;
    fStack_f4 = fStack_f4 + auVar200._4_4_;
    fStack_f0 = fStack_f0 + auVar200._8_4_;
    fStack_ec = fStack_ec + auVar200._12_4_;
    fStack_e8 = fStack_e8 + auVar200._16_4_;
    fStack_e4 = fStack_e4 + auVar200._20_4_;
    fStack_e0 = fStack_e0 + auVar200._24_4_;
    fStack_dc = fVar343 + auVar200._28_4_;
    auVar22._4_4_ = fVar185 * fStack_f4;
    auVar22._0_4_ = fVar184 * local_f8;
    auVar22._8_4_ = fVar186 * fStack_f0;
    auVar22._12_4_ = fVar201 * fStack_ec;
    auVar22._16_4_ = fVar202 * fStack_e8;
    auVar22._20_4_ = fVar203 * fStack_e4;
    auVar22._24_4_ = fVar204 * fStack_e0;
    auVar22._28_4_ = fVar343;
    auVar30._4_4_ = fVar230 * fStack_d4;
    auVar30._0_4_ = fVar229 * local_d8;
    auVar30._8_4_ = fVar231 * fStack_d0;
    auVar30._12_4_ = fVar117 * fStack_cc;
    auVar30._16_4_ = fVar315 * fStack_c8;
    auVar30._20_4_ = fVar325 * fStack_c4;
    auVar30._24_4_ = fVar327 * fStack_c0;
    auVar30._28_4_ = fVar343 + auVar200._28_4_;
    auVar22 = vsubps_avx(auVar22,auVar30);
    local_518 = auVar24._0_4_;
    fStack_514 = auVar24._4_4_;
    fStack_510 = auVar24._8_4_;
    fStack_50c = auVar24._12_4_;
    fStack_508 = auVar24._16_4_;
    fStack_504 = auVar24._20_4_;
    fStack_500 = auVar24._24_4_;
    auVar31._4_4_ = fVar185 * fStack_514;
    auVar31._0_4_ = fVar184 * local_518;
    auVar31._8_4_ = fVar186 * fStack_510;
    auVar31._12_4_ = fVar201 * fStack_50c;
    auVar31._16_4_ = fVar202 * fStack_508;
    auVar31._20_4_ = fVar203 * fStack_504;
    auVar31._24_4_ = fVar204 * fStack_500;
    auVar31._28_4_ = fVar343;
    local_558 = auVar109._0_4_;
    fStack_554 = auVar109._4_4_;
    fStack_550 = auVar109._8_4_;
    fStack_54c = auVar109._12_4_;
    fStack_548 = auVar109._16_4_;
    fStack_544 = auVar109._20_4_;
    fStack_540 = auVar109._24_4_;
    auVar32._4_4_ = fVar230 * fStack_554;
    auVar32._0_4_ = fVar229 * local_558;
    auVar32._8_4_ = fVar231 * fStack_550;
    auVar32._12_4_ = fVar117 * fStack_54c;
    auVar32._16_4_ = fVar315 * fStack_548;
    auVar32._20_4_ = fVar325 * fStack_544;
    auVar32._24_4_ = fVar327 * fStack_540;
    auVar32._28_4_ = local_98._28_4_;
    auVar29 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = local_b8._4_4_ * fVar185;
    auVar33._0_4_ = local_b8._0_4_ * fVar184;
    auVar33._8_4_ = local_b8._8_4_ * fVar186;
    auVar33._12_4_ = local_b8._12_4_ * fVar201;
    auVar33._16_4_ = local_b8._16_4_ * fVar202;
    auVar33._20_4_ = local_b8._20_4_ * fVar203;
    auVar33._24_4_ = local_b8._24_4_ * fVar204;
    auVar33._28_4_ = fVar343;
    auVar34._4_4_ = auVar110._4_4_ * fVar230;
    auVar34._0_4_ = auVar110._0_4_ * fVar229;
    auVar34._8_4_ = auVar110._8_4_ * fVar231;
    auVar34._12_4_ = auVar110._12_4_ * fVar117;
    auVar34._16_4_ = auVar110._16_4_ * fVar315;
    auVar34._20_4_ = auVar110._20_4_ * fVar325;
    auVar34._24_4_ = auVar110._24_4_ * fVar327;
    auVar34._28_4_ = local_b8._28_4_;
    local_538 = auVar23._0_4_;
    fStack_534 = auVar23._4_4_;
    fStack_530 = auVar23._8_4_;
    fStack_52c = auVar23._12_4_;
    fStack_528 = auVar23._16_4_;
    fStack_524 = auVar23._20_4_;
    fStack_520 = auVar23._24_4_;
    auVar30 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar300._4_4_ * fVar185;
    auVar35._0_4_ = auVar300._0_4_ * fVar184;
    auVar35._8_4_ = auVar300._8_4_ * fVar186;
    auVar35._12_4_ = auVar300._12_4_ * fVar201;
    auVar35._16_4_ = auVar300._16_4_ * fVar202;
    auVar35._20_4_ = auVar300._20_4_ * fVar203;
    auVar35._24_4_ = auVar300._24_4_ * fVar204;
    auVar35._28_4_ = fVar343;
    auVar36._4_4_ = fVar230 * auVar275._4_4_;
    auVar36._0_4_ = fVar229 * auVar275._0_4_;
    auVar36._8_4_ = fVar231 * auVar275._8_4_;
    auVar36._12_4_ = fVar117 * auVar275._12_4_;
    auVar36._16_4_ = fVar315 * auVar275._16_4_;
    auVar36._20_4_ = fVar325 * auVar275._20_4_;
    auVar36._24_4_ = fVar327 * auVar275._24_4_;
    auVar36._28_4_ = fStack_bc;
    auVar31 = vsubps_avx(auVar35,auVar36);
    local_118 = auVar275._0_4_ + local_118;
    fStack_114 = auVar275._4_4_ + fStack_114;
    fStack_110 = auVar275._8_4_ + fStack_110;
    fStack_10c = auVar275._12_4_ + fStack_10c;
    fStack_108 = auVar275._16_4_ + fStack_108;
    fStack_104 = auVar275._20_4_ + fStack_104;
    fStack_100 = auVar275._24_4_ + fStack_100;
    fStack_fc = auVar275._28_4_ + auVar25._28_4_;
    local_138 = auVar300._0_4_ + local_138;
    fStack_134 = auVar300._4_4_ + fStack_134;
    fStack_130 = auVar300._8_4_ + fStack_130;
    fStack_12c = auVar300._12_4_ + fStack_12c;
    fStack_128 = auVar300._16_4_ + fStack_128;
    fStack_124 = auVar300._20_4_ + fStack_124;
    fStack_120 = auVar300._24_4_ + fStack_120;
    fStack_11c = auVar300._28_4_ + auVar249._28_4_;
    auVar25._4_4_ = fVar185 * fStack_134;
    auVar25._0_4_ = fVar184 * local_138;
    auVar25._8_4_ = fVar186 * fStack_130;
    auVar25._12_4_ = fVar201 * fStack_12c;
    auVar25._16_4_ = fVar202 * fStack_128;
    auVar25._20_4_ = fVar203 * fStack_124;
    auVar25._24_4_ = fVar204 * fStack_120;
    auVar25._28_4_ = auVar300._28_4_ + auVar249._28_4_;
    auVar37._4_4_ = fStack_114 * fVar230;
    auVar37._0_4_ = local_118 * fVar229;
    auVar37._8_4_ = fStack_110 * fVar231;
    auVar37._12_4_ = fStack_10c * fVar117;
    auVar37._16_4_ = fStack_108 * fVar315;
    auVar37._20_4_ = fStack_104 * fVar325;
    auVar37._24_4_ = fStack_100 * fVar327;
    auVar37._28_4_ = fStack_fc;
    auVar25 = vsubps_avx(auVar25,auVar37);
    auVar38._4_4_ = fVar185 * auVar26._4_4_;
    auVar38._0_4_ = fVar184 * auVar26._0_4_;
    auVar38._8_4_ = fVar186 * auVar26._8_4_;
    auVar38._12_4_ = fVar201 * auVar26._12_4_;
    auVar38._16_4_ = fVar202 * auVar26._16_4_;
    auVar38._20_4_ = fVar203 * auVar26._20_4_;
    auVar38._24_4_ = fVar204 * auVar26._24_4_;
    auVar38._28_4_ = fStack_fc;
    auVar39._4_4_ = fVar230 * fStack_534;
    auVar39._0_4_ = fVar229 * local_538;
    auVar39._8_4_ = fVar231 * fStack_530;
    auVar39._12_4_ = fVar117 * fStack_52c;
    auVar39._16_4_ = fVar315 * fStack_528;
    auVar39._20_4_ = fVar325 * fStack_524;
    auVar39._24_4_ = fVar327 * fStack_520;
    auVar39._28_4_ = auVar26._28_4_;
    auVar32 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = fVar185 * local_78._4_4_;
    auVar40._0_4_ = fVar184 * local_78._0_4_;
    auVar40._8_4_ = fVar186 * local_78._8_4_;
    auVar40._12_4_ = fVar201 * local_78._12_4_;
    auVar40._16_4_ = fVar202 * local_78._16_4_;
    auVar40._20_4_ = fVar203 * local_78._20_4_;
    auVar40._24_4_ = fVar204 * local_78._24_4_;
    auVar40._28_4_ = auVar112._28_4_ + auVar27._28_4_;
    auVar27._4_4_ = auVar111._4_4_ * fVar230;
    auVar27._0_4_ = auVar111._0_4_ * fVar229;
    auVar27._8_4_ = auVar111._8_4_ * fVar231;
    auVar27._12_4_ = auVar111._12_4_ * fVar117;
    auVar27._16_4_ = auVar111._16_4_ * fVar315;
    auVar27._20_4_ = auVar111._20_4_ * fVar325;
    auVar27._24_4_ = auVar111._24_4_ * fVar327;
    auVar27._28_4_ = auVar147._28_4_ + auVar21._28_4_;
    auVar27 = vsubps_avx(auVar40,auVar27);
    auVar23 = vminps_avx(auVar28,auVar22);
    auVar109 = vmaxps_avx(auVar28,auVar22);
    auVar24 = vminps_avx(auVar29,auVar30);
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar29,auVar30);
    auVar109 = vmaxps_avx(auVar109,auVar23);
    auVar21 = vminps_avx(auVar31,auVar25);
    auVar23 = vmaxps_avx(auVar31,auVar25);
    auVar22 = vminps_avx(auVar32,auVar27);
    auVar22 = vminps_avx(auVar21,auVar22);
    auVar22 = vminps_avx(auVar24,auVar22);
    auVar24 = vmaxps_avx(auVar32,auVar27);
    auVar23 = vmaxps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar109,auVar23);
    auVar109 = vcmpps_avx(auVar22,local_228,2);
    auVar23 = vcmpps_avx(auVar23,local_248,5);
    auVar109 = vandps_avx(auVar23,auVar109);
    auVar23 = local_158 & auVar109;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar23 = vsubps_avx(auVar110,local_98);
      auVar24 = vsubps_avx(auVar111,auVar275);
      fVar185 = auVar23._0_4_ + auVar24._0_4_;
      fVar186 = auVar23._4_4_ + auVar24._4_4_;
      fVar201 = auVar23._8_4_ + auVar24._8_4_;
      fVar202 = auVar23._12_4_ + auVar24._12_4_;
      fVar203 = auVar23._16_4_ + auVar24._16_4_;
      fVar204 = auVar23._20_4_ + auVar24._20_4_;
      fVar229 = auVar23._24_4_ + auVar24._24_4_;
      auVar22 = vsubps_avx(local_b8,auVar200);
      auVar25 = vsubps_avx(local_78,auVar300);
      fVar230 = auVar22._0_4_ + auVar25._0_4_;
      fVar231 = auVar22._4_4_ + auVar25._4_4_;
      fVar117 = auVar22._8_4_ + auVar25._8_4_;
      fVar315 = auVar22._12_4_ + auVar25._12_4_;
      fVar325 = auVar22._16_4_ + auVar25._16_4_;
      fVar327 = auVar22._20_4_ + auVar25._20_4_;
      fVar329 = auVar22._24_4_ + auVar25._24_4_;
      fVar184 = auVar25._28_4_;
      auVar41._4_4_ = auVar200._4_4_ * fVar186;
      auVar41._0_4_ = auVar200._0_4_ * fVar185;
      auVar41._8_4_ = auVar200._8_4_ * fVar201;
      auVar41._12_4_ = auVar200._12_4_ * fVar202;
      auVar41._16_4_ = auVar200._16_4_ * fVar203;
      auVar41._20_4_ = auVar200._20_4_ * fVar204;
      auVar41._24_4_ = auVar200._24_4_ * fVar229;
      auVar41._28_4_ = auVar200._28_4_;
      auVar42._4_4_ = local_98._4_4_ * fVar231;
      auVar42._0_4_ = local_98._0_4_ * fVar230;
      auVar42._8_4_ = local_98._8_4_ * fVar117;
      auVar42._12_4_ = local_98._12_4_ * fVar315;
      auVar42._16_4_ = local_98._16_4_ * fVar325;
      auVar42._20_4_ = local_98._20_4_ * fVar327;
      auVar42._24_4_ = local_98._24_4_ * fVar329;
      auVar42._28_4_ = local_98._28_4_;
      auVar25 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar186 * fStack_f4;
      auVar43._0_4_ = fVar185 * local_f8;
      auVar43._8_4_ = fVar201 * fStack_f0;
      auVar43._12_4_ = fVar202 * fStack_ec;
      auVar43._16_4_ = fVar203 * fStack_e8;
      auVar43._20_4_ = fVar204 * fStack_e4;
      auVar43._24_4_ = fVar229 * fStack_e0;
      auVar43._28_4_ = auVar200._28_4_;
      auVar44._4_4_ = fVar231 * fStack_d4;
      auVar44._0_4_ = fVar230 * local_d8;
      auVar44._8_4_ = fVar117 * fStack_d0;
      auVar44._12_4_ = fVar315 * fStack_cc;
      auVar44._16_4_ = fVar325 * fStack_c8;
      auVar44._20_4_ = fVar327 * fStack_c4;
      auVar44._24_4_ = fVar329 * fStack_c0;
      auVar44._28_4_ = fVar184;
      auVar27 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar186 * fStack_514;
      auVar45._0_4_ = fVar185 * local_518;
      auVar45._8_4_ = fVar201 * fStack_510;
      auVar45._12_4_ = fVar202 * fStack_50c;
      auVar45._16_4_ = fVar203 * fStack_508;
      auVar45._20_4_ = fVar204 * fStack_504;
      auVar45._24_4_ = fVar229 * fStack_500;
      auVar45._28_4_ = fVar184;
      auVar46._4_4_ = fVar231 * fStack_554;
      auVar46._0_4_ = fVar230 * local_558;
      auVar46._8_4_ = fVar117 * fStack_550;
      auVar46._12_4_ = fVar315 * fStack_54c;
      auVar46._16_4_ = fVar325 * fStack_548;
      auVar46._20_4_ = fVar327 * fStack_544;
      auVar46._24_4_ = fVar329 * fStack_540;
      auVar46._28_4_ = auVar21._28_4_;
      auVar112 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = local_b8._4_4_ * fVar186;
      auVar47._0_4_ = local_b8._0_4_ * fVar185;
      auVar47._8_4_ = local_b8._8_4_ * fVar201;
      auVar47._12_4_ = local_b8._12_4_ * fVar202;
      auVar47._16_4_ = local_b8._16_4_ * fVar203;
      auVar47._20_4_ = local_b8._20_4_ * fVar204;
      auVar47._24_4_ = local_b8._24_4_ * fVar229;
      auVar47._28_4_ = auVar21._28_4_;
      auVar48._4_4_ = auVar110._4_4_ * fVar231;
      auVar48._0_4_ = auVar110._0_4_ * fVar230;
      auVar48._8_4_ = auVar110._8_4_ * fVar117;
      auVar48._12_4_ = auVar110._12_4_ * fVar315;
      auVar48._16_4_ = auVar110._16_4_ * fVar325;
      auVar48._20_4_ = auVar110._20_4_ * fVar327;
      uVar8 = auVar110._28_4_;
      auVar48._24_4_ = auVar110._24_4_ * fVar329;
      auVar48._28_4_ = uVar8;
      auVar110 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = auVar300._4_4_ * fVar186;
      auVar49._0_4_ = auVar300._0_4_ * fVar185;
      auVar49._8_4_ = auVar300._8_4_ * fVar201;
      auVar49._12_4_ = auVar300._12_4_ * fVar202;
      auVar49._16_4_ = auVar300._16_4_ * fVar203;
      auVar49._20_4_ = auVar300._20_4_ * fVar204;
      auVar49._24_4_ = auVar300._24_4_ * fVar229;
      auVar49._28_4_ = uVar8;
      auVar50._4_4_ = auVar275._4_4_ * fVar231;
      auVar50._0_4_ = auVar275._0_4_ * fVar230;
      auVar50._8_4_ = auVar275._8_4_ * fVar117;
      auVar50._12_4_ = auVar275._12_4_ * fVar315;
      auVar50._16_4_ = auVar275._16_4_ * fVar325;
      auVar50._20_4_ = auVar275._20_4_ * fVar327;
      auVar50._24_4_ = auVar275._24_4_ * fVar329;
      auVar50._28_4_ = auVar275._28_4_;
      auVar147 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar186 * fStack_134;
      auVar51._0_4_ = fVar185 * local_138;
      auVar51._8_4_ = fVar201 * fStack_130;
      auVar51._12_4_ = fVar202 * fStack_12c;
      auVar51._16_4_ = fVar203 * fStack_128;
      auVar51._20_4_ = fVar204 * fStack_124;
      auVar51._24_4_ = fVar229 * fStack_120;
      auVar51._28_4_ = uVar8;
      auVar52._4_4_ = fVar231 * fStack_114;
      auVar52._0_4_ = fVar230 * local_118;
      auVar52._8_4_ = fVar117 * fStack_110;
      auVar52._12_4_ = fVar315 * fStack_10c;
      auVar52._16_4_ = fVar325 * fStack_108;
      auVar52._20_4_ = fVar327 * fStack_104;
      auVar52._24_4_ = fVar329 * fStack_100;
      auVar52._28_4_ = auVar300._28_4_;
      auVar28 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar186 * auVar26._4_4_;
      auVar53._0_4_ = fVar185 * auVar26._0_4_;
      auVar53._8_4_ = fVar201 * auVar26._8_4_;
      auVar53._12_4_ = fVar202 * auVar26._12_4_;
      auVar53._16_4_ = fVar203 * auVar26._16_4_;
      auVar53._20_4_ = fVar204 * auVar26._20_4_;
      auVar53._24_4_ = fVar229 * auVar26._24_4_;
      auVar53._28_4_ = auVar300._28_4_;
      auVar54._4_4_ = fStack_534 * fVar231;
      auVar54._0_4_ = local_538 * fVar230;
      auVar54._8_4_ = fStack_530 * fVar117;
      auVar54._12_4_ = fStack_52c * fVar315;
      auVar54._16_4_ = fStack_528 * fVar325;
      auVar54._20_4_ = fStack_524 * fVar327;
      auVar54._24_4_ = fStack_520 * fVar329;
      auVar54._28_4_ = local_b8._28_4_;
      auVar26 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = local_78._4_4_ * fVar186;
      auVar55._0_4_ = local_78._0_4_ * fVar185;
      auVar55._8_4_ = local_78._8_4_ * fVar201;
      auVar55._12_4_ = local_78._12_4_ * fVar202;
      auVar55._16_4_ = local_78._16_4_ * fVar203;
      auVar55._20_4_ = local_78._20_4_ * fVar204;
      auVar55._24_4_ = local_78._24_4_ * fVar229;
      auVar55._28_4_ = auVar23._28_4_ + auVar24._28_4_;
      auVar56._4_4_ = auVar111._4_4_ * fVar231;
      auVar56._0_4_ = auVar111._0_4_ * fVar230;
      auVar56._8_4_ = auVar111._8_4_ * fVar117;
      auVar56._12_4_ = auVar111._12_4_ * fVar315;
      auVar56._16_4_ = auVar111._16_4_ * fVar325;
      auVar56._20_4_ = auVar111._20_4_ * fVar327;
      auVar56._24_4_ = auVar111._24_4_ * fVar329;
      auVar56._28_4_ = auVar22._28_4_ + fVar184;
      auVar111 = vsubps_avx(auVar55,auVar56);
      auVar24 = vminps_avx(auVar25,auVar27);
      auVar23 = vmaxps_avx(auVar25,auVar27);
      auVar21 = vminps_avx(auVar112,auVar110);
      auVar21 = vminps_avx(auVar24,auVar21);
      auVar24 = vmaxps_avx(auVar112,auVar110);
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar22 = vminps_avx(auVar147,auVar28);
      auVar24 = vmaxps_avx(auVar147,auVar28);
      auVar110 = vminps_avx(auVar26,auVar111);
      auVar22 = vminps_avx(auVar22,auVar110);
      auVar22 = vminps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar26,auVar111);
      auVar24 = vmaxps_avx(auVar24,auVar21);
      auVar24 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vcmpps_avx(auVar22,local_228,2);
      auVar24 = vcmpps_avx(auVar24,local_248,5);
      auVar23 = vandps_avx(auVar24,auVar23);
      auVar109 = vandps_avx(local_158,auVar109);
      auVar24 = auVar109 & auVar23;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0x7f,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0xbf,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar24[0x1f] < '\0') {
        auVar109 = vandps_avx(auVar23,auVar109);
        uVar73 = vmovmskps_avx(auVar109);
        if (uVar73 != 0) {
          uVar70 = (ulong)uVar74;
          auStack_398[uVar70] = uVar73 & 0xff;
          uVar9 = vmovlps_avx(auVar118);
          *(undefined8 *)(afStack_208 + uVar70 * 2) = uVar9;
          uVar68 = vmovlps_avx(auVar79);
          auStack_58[uVar70] = uVar68;
          uVar74 = uVar74 + 1;
        }
      }
    }
    if (uVar74 != 0) {
      do {
        uVar70 = (ulong)(uVar74 - 1);
        uVar73 = auStack_398[uVar70];
        fVar184 = afStack_208[uVar70 * 2];
        fVar185 = afStack_208[uVar70 * 2 + 1];
        auVar318._8_8_ = 0;
        auVar318._0_8_ = auStack_58[uVar70];
        auVar324 = ZEXT1664(auVar318);
        uVar68 = 0;
        if (uVar73 != 0) {
          for (; (uVar73 >> uVar68 & 1) == 0; uVar68 = uVar68 + 1) {
          }
        }
        uVar73 = uVar73 - 1 & uVar73;
        auStack_398[uVar70] = uVar73;
        if (uVar73 == 0) {
          uVar74 = uVar74 - 1;
        }
        fVar201 = (float)(uVar68 + 1) * 0.14285715;
        fVar186 = (1.0 - (float)uVar68 * 0.14285715) * fVar184 +
                  fVar185 * (float)uVar68 * 0.14285715;
        fVar184 = (1.0 - fVar201) * fVar184 + fVar185 * fVar201;
        fVar185 = fVar184 - fVar186;
        if (0.16666667 <= fVar185) {
          auVar96 = vinsertps_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar184),0x10);
          auVar362 = ZEXT1664(auVar96);
          goto LAB_00f2604b;
        }
        auVar96 = vshufps_avx(auVar318,auVar318,0x50);
        auVar129._8_4_ = 0x3f800000;
        auVar129._0_8_ = 0x3f8000003f800000;
        auVar129._12_4_ = 0x3f800000;
        auVar194 = vsubps_avx(auVar129,auVar96);
        fVar201 = auVar96._0_4_;
        fVar202 = auVar96._4_4_;
        fVar203 = auVar96._8_4_;
        fVar204 = auVar96._12_4_;
        fVar229 = auVar194._0_4_;
        fVar230 = auVar194._4_4_;
        fVar231 = auVar194._8_4_;
        fVar117 = auVar194._12_4_;
        auVar165._0_4_ = fVar201 * auVar289._0_4_ + fVar229 * fVar250;
        auVar165._4_4_ = fVar202 * auVar289._4_4_ + fVar230 * fVar232;
        auVar165._8_4_ = fVar203 * auVar289._0_4_ + fVar231 * fVar250;
        auVar165._12_4_ = fVar204 * auVar289._4_4_ + fVar117 * fVar232;
        auVar217._0_4_ = fVar201 * auVar295._0_4_ + fVar229 * fVar251;
        auVar217._4_4_ = fVar202 * auVar295._4_4_ + fVar230 * fVar75;
        auVar217._8_4_ = fVar203 * auVar295._0_4_ + fVar231 * fVar251;
        auVar217._12_4_ = fVar204 * auVar295._4_4_ + fVar117 * fVar75;
        auVar242._0_4_ = fVar201 * auVar310._0_4_ + auVar215._0_4_ * fVar229;
        auVar242._4_4_ = fVar202 * auVar310._4_4_ + auVar215._4_4_ * fVar230;
        auVar242._8_4_ = fVar203 * auVar310._0_4_ + auVar215._0_4_ * fVar231;
        auVar242._12_4_ = fVar204 * auVar310._4_4_ + auVar215._4_4_ * fVar117;
        auVar93._0_4_ = auVar91._0_4_ * fVar201 + auVar128._0_4_ * fVar229;
        auVar93._4_4_ = auVar91._4_4_ * fVar202 + auVar128._4_4_ * fVar230;
        auVar93._8_4_ = auVar91._0_4_ * fVar203 + auVar128._0_4_ * fVar231;
        auVar93._12_4_ = auVar91._4_4_ * fVar204 + auVar128._4_4_ * fVar117;
        auVar148._16_16_ = auVar165;
        auVar148._0_16_ = auVar165;
        auVar182._16_16_ = auVar217;
        auVar182._0_16_ = auVar217;
        auVar228._16_16_ = auVar242;
        auVar228._0_16_ = auVar242;
        auVar109 = ZEXT2032(CONCAT416(fVar184,ZEXT416((uint)fVar186)));
        auVar109 = vshufps_avx(auVar109,auVar109,0);
        auVar23 = vsubps_avx(auVar182,auVar148);
        fVar201 = auVar109._0_4_;
        fVar202 = auVar109._4_4_;
        fVar203 = auVar109._8_4_;
        fVar204 = auVar109._12_4_;
        fVar229 = auVar109._16_4_;
        fVar230 = auVar109._20_4_;
        fVar231 = auVar109._24_4_;
        auVar149._0_4_ = auVar165._0_4_ + auVar23._0_4_ * fVar201;
        auVar149._4_4_ = auVar165._4_4_ + auVar23._4_4_ * fVar202;
        auVar149._8_4_ = auVar165._8_4_ + auVar23._8_4_ * fVar203;
        auVar149._12_4_ = auVar165._12_4_ + auVar23._12_4_ * fVar204;
        auVar149._16_4_ = auVar165._0_4_ + auVar23._16_4_ * fVar229;
        auVar149._20_4_ = auVar165._4_4_ + auVar23._20_4_ * fVar230;
        auVar149._24_4_ = auVar165._8_4_ + auVar23._24_4_ * fVar231;
        auVar149._28_4_ = auVar165._12_4_ + auVar23._28_4_;
        auVar109 = vsubps_avx(auVar228,auVar182);
        auVar183._0_4_ = auVar217._0_4_ + auVar109._0_4_ * fVar201;
        auVar183._4_4_ = auVar217._4_4_ + auVar109._4_4_ * fVar202;
        auVar183._8_4_ = auVar217._8_4_ + auVar109._8_4_ * fVar203;
        auVar183._12_4_ = auVar217._12_4_ + auVar109._12_4_ * fVar204;
        auVar183._16_4_ = auVar217._0_4_ + auVar109._16_4_ * fVar229;
        auVar183._20_4_ = auVar217._4_4_ + auVar109._20_4_ * fVar230;
        auVar183._24_4_ = auVar217._8_4_ + auVar109._24_4_ * fVar231;
        auVar183._28_4_ = auVar217._12_4_ + auVar109._28_4_;
        auVar96 = vsubps_avx(auVar93,auVar242);
        auVar113._0_4_ = auVar242._0_4_ + auVar96._0_4_ * fVar201;
        auVar113._4_4_ = auVar242._4_4_ + auVar96._4_4_ * fVar202;
        auVar113._8_4_ = auVar242._8_4_ + auVar96._8_4_ * fVar203;
        auVar113._12_4_ = auVar242._12_4_ + auVar96._12_4_ * fVar204;
        auVar113._16_4_ = auVar242._0_4_ + auVar96._0_4_ * fVar229;
        auVar113._20_4_ = auVar242._4_4_ + auVar96._4_4_ * fVar230;
        auVar113._24_4_ = auVar242._8_4_ + auVar96._8_4_ * fVar231;
        auVar113._28_4_ = auVar242._12_4_ + auVar96._12_4_;
        auVar109 = vsubps_avx(auVar183,auVar149);
        auVar150._0_4_ = auVar149._0_4_ + fVar201 * auVar109._0_4_;
        auVar150._4_4_ = auVar149._4_4_ + fVar202 * auVar109._4_4_;
        auVar150._8_4_ = auVar149._8_4_ + fVar203 * auVar109._8_4_;
        auVar150._12_4_ = auVar149._12_4_ + fVar204 * auVar109._12_4_;
        auVar150._16_4_ = auVar149._16_4_ + fVar229 * auVar109._16_4_;
        auVar150._20_4_ = auVar149._20_4_ + fVar230 * auVar109._20_4_;
        auVar150._24_4_ = auVar149._24_4_ + fVar231 * auVar109._24_4_;
        auVar150._28_4_ = auVar149._28_4_ + auVar109._28_4_;
        auVar109 = vsubps_avx(auVar113,auVar183);
        auVar114._0_4_ = auVar183._0_4_ + fVar201 * auVar109._0_4_;
        auVar114._4_4_ = auVar183._4_4_ + fVar202 * auVar109._4_4_;
        auVar114._8_4_ = auVar183._8_4_ + fVar203 * auVar109._8_4_;
        auVar114._12_4_ = auVar183._12_4_ + fVar204 * auVar109._12_4_;
        auVar114._16_4_ = auVar183._16_4_ + fVar229 * auVar109._16_4_;
        auVar114._20_4_ = auVar183._20_4_ + fVar230 * auVar109._20_4_;
        auVar114._24_4_ = auVar183._24_4_ + fVar231 * auVar109._24_4_;
        auVar114._28_4_ = auVar183._28_4_ + auVar109._28_4_;
        auVar109 = vsubps_avx(auVar114,auVar150);
        auVar258._0_4_ = auVar150._0_4_ + fVar201 * auVar109._0_4_;
        auVar258._4_4_ = auVar150._4_4_ + fVar202 * auVar109._4_4_;
        auVar258._8_4_ = auVar150._8_4_ + fVar203 * auVar109._8_4_;
        auVar258._12_4_ = auVar150._12_4_ + fVar204 * auVar109._12_4_;
        auVar263._16_4_ = auVar150._16_4_ + fVar229 * auVar109._16_4_;
        auVar263._0_16_ = auVar258;
        auVar263._20_4_ = auVar150._20_4_ + fVar230 * auVar109._20_4_;
        auVar263._24_4_ = auVar150._24_4_ + fVar231 * auVar109._24_4_;
        auVar263._28_4_ = auVar150._28_4_ + auVar183._28_4_;
        auVar264 = auVar263._16_16_;
        auVar131 = vshufps_avx(ZEXT416((uint)(fVar185 * 0.33333334)),
                               ZEXT416((uint)(fVar185 * 0.33333334)),0);
        auVar218._0_4_ = auVar258._0_4_ + auVar131._0_4_ * auVar109._0_4_ * 3.0;
        auVar218._4_4_ = auVar258._4_4_ + auVar131._4_4_ * auVar109._4_4_ * 3.0;
        auVar218._8_4_ = auVar258._8_4_ + auVar131._8_4_ * auVar109._8_4_ * 3.0;
        auVar218._12_4_ = auVar258._12_4_ + auVar131._12_4_ * auVar109._12_4_ * 3.0;
        auVar181 = vshufpd_avx(auVar258,auVar258,3);
        auVar143 = vshufpd_avx(auVar264,auVar264,3);
        auVar96 = vsubps_avx(auVar181,auVar258);
        auVar194 = vsubps_avx(auVar143,auVar264);
        auVar94._0_4_ = auVar96._0_4_ + auVar194._0_4_;
        auVar94._4_4_ = auVar96._4_4_ + auVar194._4_4_;
        auVar94._8_4_ = auVar96._8_4_ + auVar194._8_4_;
        auVar94._12_4_ = auVar96._12_4_ + auVar194._12_4_;
        auVar96 = vmovshdup_avx(auVar258);
        auVar194 = vmovshdup_avx(auVar218);
        auVar167 = vshufps_avx(auVar94,auVar94,0);
        auVar132 = vshufps_avx(auVar94,auVar94,0x55);
        fVar201 = auVar132._0_4_;
        fVar202 = auVar132._4_4_;
        fVar203 = auVar132._8_4_;
        fVar204 = auVar132._12_4_;
        fVar229 = auVar167._0_4_;
        fVar230 = auVar167._4_4_;
        fVar231 = auVar167._8_4_;
        fVar117 = auVar167._12_4_;
        auVar95._0_4_ = fVar229 * auVar258._0_4_ + auVar96._0_4_ * fVar201;
        auVar95._4_4_ = fVar230 * auVar258._4_4_ + auVar96._4_4_ * fVar202;
        auVar95._8_4_ = fVar231 * auVar258._8_4_ + auVar96._8_4_ * fVar203;
        auVar95._12_4_ = fVar117 * auVar258._12_4_ + auVar96._12_4_ * fVar204;
        auVar319._0_4_ = fVar229 * auVar218._0_4_ + auVar194._0_4_ * fVar201;
        auVar319._4_4_ = fVar230 * auVar218._4_4_ + auVar194._4_4_ * fVar202;
        auVar319._8_4_ = fVar231 * auVar218._8_4_ + auVar194._8_4_ * fVar203;
        auVar319._12_4_ = fVar117 * auVar218._12_4_ + auVar194._12_4_ * fVar204;
        auVar194 = vshufps_avx(auVar95,auVar95,0xe8);
        auVar167 = vshufps_avx(auVar319,auVar319,0xe8);
        auVar96 = vcmpps_avx(auVar194,auVar167,1);
        uVar73 = vextractps_avx(auVar96,0);
        auVar132 = auVar319;
        if ((uVar73 & 1) == 0) {
          auVar132 = auVar95;
        }
        auVar130._0_4_ = auVar131._0_4_ * auVar109._16_4_ * 3.0;
        auVar130._4_4_ = auVar131._4_4_ * auVar109._20_4_ * 3.0;
        auVar130._8_4_ = auVar131._8_4_ * auVar109._24_4_ * 3.0;
        auVar130._12_4_ = auVar131._12_4_ * 0.0;
        auVar78 = vsubps_avx(auVar264,auVar130);
        auVar131 = vmovshdup_avx(auVar78);
        auVar264 = vmovshdup_avx(auVar264);
        fVar315 = auVar78._0_4_;
        fVar325 = auVar78._4_4_;
        auVar243._0_4_ = fVar315 * fVar229 + auVar131._0_4_ * fVar201;
        auVar243._4_4_ = fVar325 * fVar230 + auVar131._4_4_ * fVar202;
        auVar243._8_4_ = auVar78._8_4_ * fVar231 + auVar131._8_4_ * fVar203;
        auVar243._12_4_ = auVar78._12_4_ * fVar117 + auVar131._12_4_ * fVar204;
        auVar361._0_4_ = fVar229 * auVar263._16_4_ + auVar264._0_4_ * fVar201;
        auVar361._4_4_ = fVar230 * auVar263._20_4_ + auVar264._4_4_ * fVar202;
        auVar361._8_4_ = fVar231 * auVar263._24_4_ + auVar264._8_4_ * fVar203;
        auVar361._12_4_ = fVar117 * auVar263._28_4_ + auVar264._12_4_ * fVar204;
        auVar264 = vshufps_avx(auVar243,auVar243,0xe8);
        auVar77 = vshufps_avx(auVar361,auVar361,0xe8);
        auVar131 = vcmpps_avx(auVar264,auVar77,1);
        uVar73 = vextractps_avx(auVar131,0);
        auVar79 = auVar361;
        if ((uVar73 & 1) == 0) {
          auVar79 = auVar243;
        }
        auVar132 = vmaxss_avx(auVar79,auVar132);
        auVar194 = vminps_avx(auVar194,auVar167);
        auVar167 = vminps_avx(auVar264,auVar77);
        auVar167 = vminps_avx(auVar194,auVar167);
        auVar96 = vshufps_avx(auVar96,auVar96,0x55);
        auVar96 = vblendps_avx(auVar96,auVar131,2);
        auVar131 = vpslld_avx(auVar96,0x1f);
        auVar96 = vshufpd_avx(auVar319,auVar319,1);
        auVar96 = vinsertps_avx(auVar96,auVar361,0x9c);
        auVar194 = vshufpd_avx(auVar95,auVar95,1);
        auVar194 = vinsertps_avx(auVar194,auVar243,0x9c);
        auVar96 = vblendvps_avx(auVar194,auVar96,auVar131);
        auVar194 = vmovshdup_avx(auVar96);
        auVar96 = vmaxss_avx(auVar194,auVar96);
        fVar203 = auVar167._0_4_;
        auVar194 = vmovshdup_avx(auVar167);
        fVar202 = auVar96._0_4_;
        fVar204 = auVar194._0_4_;
        fVar201 = auVar132._0_4_;
        if ((0.0001 <= fVar203) || (fVar202 <= -0.0001)) {
          if ((fVar204 < 0.0001 && -0.0001 < fVar201) || (fVar203 < 0.0001 && -0.0001 < fVar201))
          goto LAB_00f26a51;
          auVar131 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar96,1);
          auVar194 = vcmpps_avx(auVar194,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar194 = vandps_avx(auVar194,auVar131);
          if ((auVar194 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_00f26a51;
        }
        else {
LAB_00f26a51:
          auVar131 = vcmpps_avx(auVar167,_DAT_01f7aa10,1);
          auVar194 = vcmpss_avx(auVar132,ZEXT416(0) << 0x20,1);
          auVar166._8_4_ = 0x3f800000;
          auVar166._0_8_ = 0x3f8000003f800000;
          auVar166._12_4_ = 0x3f800000;
          auVar219._8_4_ = 0xbf800000;
          auVar219._0_8_ = 0xbf800000bf800000;
          auVar219._12_4_ = 0xbf800000;
          auVar194 = vblendvps_avx(auVar166,auVar219,auVar194);
          auVar131 = vblendvps_avx(auVar166,auVar219,auVar131);
          auVar167 = vcmpss_avx(auVar131,auVar194,4);
          auVar167 = vpshufd_avx(ZEXT416(auVar167._0_4_ & 1),0x50);
          auVar167 = vpslld_avx(auVar167,0x1f);
          auVar167 = vpsrad_avx(auVar167,0x1f);
          auVar167 = vpandn_avx(auVar167,_DAT_01fafeb0);
          auVar132 = vmovshdup_avx(auVar131);
          fVar229 = auVar132._0_4_;
          if ((auVar131._0_4_ != fVar229) || (NAN(auVar131._0_4_) || NAN(fVar229))) {
            if ((fVar204 != fVar203) || (NAN(fVar204) || NAN(fVar203))) {
              fVar203 = -fVar203 / (fVar204 - fVar203);
              auVar131 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar203) * 0.0 + fVar203)));
            }
            else {
              auVar131 = ZEXT816(0x3f80000000000000);
              if ((fVar203 != 0.0) || (NAN(fVar203))) {
                auVar131 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar264 = vcmpps_avx(auVar167,auVar131,1);
            auVar132 = vblendps_avx(auVar167,auVar131,2);
            auVar131 = vblendps_avx(auVar131,auVar167,2);
            auVar167 = vblendvps_avx(auVar131,auVar132,auVar264);
          }
          auVar96 = vcmpss_avx(auVar96,ZEXT416(0) << 0x20,1);
          auVar168._8_4_ = 0x3f800000;
          auVar168._0_8_ = 0x3f8000003f800000;
          auVar168._12_4_ = 0x3f800000;
          auVar220._8_4_ = 0xbf800000;
          auVar220._0_8_ = 0xbf800000bf800000;
          auVar220._12_4_ = 0xbf800000;
          auVar96 = vblendvps_avx(auVar168,auVar220,auVar96);
          fVar203 = auVar96._0_4_;
          if ((auVar194._0_4_ != fVar203) || (NAN(auVar194._0_4_) || NAN(fVar203))) {
            if ((fVar202 != fVar201) || (NAN(fVar202) || NAN(fVar201))) {
              fVar201 = -fVar201 / (fVar202 - fVar201);
              auVar96 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar201) * 0.0 + fVar201)));
            }
            else {
              auVar96 = ZEXT816(0x3f80000000000000);
              if ((fVar201 != 0.0) || (NAN(fVar201))) {
                auVar96 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar131 = vcmpps_avx(auVar167,auVar96,1);
            auVar194 = vblendps_avx(auVar167,auVar96,2);
            auVar96 = vblendps_avx(auVar96,auVar167,2);
            auVar167 = vblendvps_avx(auVar96,auVar194,auVar131);
          }
          if ((fVar229 != fVar203) || (NAN(fVar229) || NAN(fVar203))) {
            auVar97._8_4_ = 0x3f800000;
            auVar97._0_8_ = 0x3f8000003f800000;
            auVar97._12_4_ = 0x3f800000;
            auVar96 = vcmpps_avx(auVar167,auVar97,1);
            auVar194 = vinsertps_avx(auVar167,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar169._4_12_ = auVar167._4_12_;
            auVar169._0_4_ = 0x3f800000;
            auVar167 = vblendvps_avx(auVar169,auVar194,auVar96);
          }
          auVar96 = vcmpps_avx(auVar167,_DAT_01f7b6f0,1);
          auVar59._12_4_ = 0;
          auVar59._0_12_ = auVar167._4_12_;
          auVar194 = vinsertps_avx(auVar167,ZEXT416(0x3f800000),0x10);
          auVar96 = vblendvps_avx(auVar194,auVar59 << 0x20,auVar96);
          auVar194 = vmovshdup_avx(auVar96);
          if (auVar96._0_4_ <= auVar194._0_4_) {
            auVar98._0_4_ = auVar96._0_4_ + -0.1;
            auVar98._4_4_ = auVar96._4_4_ + 0.1;
            auVar98._8_4_ = auVar96._8_4_ + 0.0;
            auVar98._12_4_ = auVar96._12_4_ + 0.0;
            auVar131 = vshufpd_avx(auVar218,auVar218,3);
            auVar259._8_8_ = 0x3f80000000000000;
            auVar259._0_8_ = 0x3f80000000000000;
            auVar96 = vcmpps_avx(auVar98,auVar259,1);
            auVar57._12_4_ = 0;
            auVar57._0_12_ = auVar98._4_12_;
            auVar194 = vinsertps_avx(auVar98,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar96 = vblendvps_avx(auVar194,auVar57 << 0x20,auVar96);
            auVar194 = vshufpd_avx(auVar78,auVar78,3);
            auVar167 = vshufps_avx(auVar96,auVar96,0x50);
            auVar260._8_4_ = 0x3f800000;
            auVar260._0_8_ = 0x3f8000003f800000;
            auVar260._12_4_ = 0x3f800000;
            auVar132 = vsubps_avx(auVar260,auVar167);
            local_488._0_4_ = auVar181._0_4_;
            local_488._4_4_ = auVar181._4_4_;
            fStack_480 = auVar181._8_4_;
            fStack_47c = auVar181._12_4_;
            fVar201 = auVar167._0_4_;
            fVar202 = auVar167._4_4_;
            fVar203 = auVar167._8_4_;
            fVar204 = auVar167._12_4_;
            local_588 = auVar143._0_4_;
            fStack_584 = auVar143._4_4_;
            fStack_580 = auVar143._8_4_;
            fStack_57c = auVar143._12_4_;
            fVar229 = auVar132._0_4_;
            fVar230 = auVar132._4_4_;
            fVar231 = auVar132._8_4_;
            fVar117 = auVar132._12_4_;
            auVar99._0_4_ = fVar201 * (float)local_488._0_4_ + fVar229 * auVar258._0_4_;
            auVar99._4_4_ = fVar202 * (float)local_488._4_4_ + fVar230 * auVar258._4_4_;
            auVar99._8_4_ = fVar203 * fStack_480 + fVar231 * auVar258._0_4_;
            auVar99._12_4_ = fVar204 * fStack_47c + fVar117 * auVar258._4_4_;
            auVar244._0_4_ = auVar131._0_4_ * fVar201 + fVar229 * auVar218._0_4_;
            auVar244._4_4_ = auVar131._4_4_ * fVar202 + fVar230 * auVar218._4_4_;
            auVar244._8_4_ = auVar131._8_4_ * fVar203 + fVar231 * auVar218._0_4_;
            auVar244._12_4_ = auVar131._12_4_ * fVar204 + fVar117 * auVar218._4_4_;
            auVar273._0_4_ = auVar194._0_4_ * fVar201 + fVar229 * fVar315;
            auVar273._4_4_ = auVar194._4_4_ * fVar202 + fVar230 * fVar325;
            auVar273._8_4_ = auVar194._8_4_ * fVar203 + fVar231 * fVar315;
            auVar273._12_4_ = auVar194._12_4_ * fVar204 + fVar117 * fVar325;
            auVar311._0_4_ = fVar201 * local_588 + fVar229 * auVar263._16_4_;
            auVar311._4_4_ = fVar202 * fStack_584 + fVar230 * auVar263._20_4_;
            auVar311._8_4_ = fVar203 * fStack_580 + fVar231 * auVar263._16_4_;
            auVar311._12_4_ = fVar204 * fStack_57c + fVar117 * auVar263._20_4_;
            auVar143 = vsubps_avx(auVar260,auVar96);
            auVar194 = vmovshdup_avx(auVar318);
            auVar181 = vmovsldup_avx(auVar318);
            auVar261._0_4_ = auVar143._0_4_ * auVar181._0_4_ + auVar96._0_4_ * auVar194._0_4_;
            auVar261._4_4_ = auVar143._4_4_ * auVar181._4_4_ + auVar96._4_4_ * auVar194._4_4_;
            auVar261._8_4_ = auVar143._8_4_ * auVar181._8_4_ + auVar96._8_4_ * auVar194._8_4_;
            auVar261._12_4_ = auVar143._12_4_ * auVar181._12_4_ + auVar96._12_4_ * auVar194._12_4_;
            auVar78 = vmovshdup_avx(auVar261);
            auVar96 = vsubps_avx(auVar244,auVar99);
            auVar170._0_4_ = auVar96._0_4_ * 3.0;
            auVar170._4_4_ = auVar96._4_4_ * 3.0;
            auVar170._8_4_ = auVar96._8_4_ * 3.0;
            auVar170._12_4_ = auVar96._12_4_ * 3.0;
            auVar96 = vsubps_avx(auVar273,auVar244);
            auVar197._0_4_ = auVar96._0_4_ * 3.0;
            auVar197._4_4_ = auVar96._4_4_ * 3.0;
            auVar197._8_4_ = auVar96._8_4_ * 3.0;
            auVar197._12_4_ = auVar96._12_4_ * 3.0;
            auVar96 = vsubps_avx(auVar311,auVar273);
            auVar290._0_4_ = auVar96._0_4_ * 3.0;
            auVar290._4_4_ = auVar96._4_4_ * 3.0;
            auVar290._8_4_ = auVar96._8_4_ * 3.0;
            auVar290._12_4_ = auVar96._12_4_ * 3.0;
            auVar194 = vminps_avx(auVar197,auVar290);
            auVar96 = vmaxps_avx(auVar197,auVar290);
            auVar194 = vminps_avx(auVar170,auVar194);
            auVar96 = vmaxps_avx(auVar170,auVar96);
            auVar181 = vshufpd_avx(auVar194,auVar194,3);
            auVar143 = vshufpd_avx(auVar96,auVar96,3);
            auVar194 = vminps_avx(auVar194,auVar181);
            auVar96 = vmaxps_avx(auVar96,auVar143);
            auVar181 = vshufps_avx(ZEXT416((uint)(1.0 / fVar185)),ZEXT416((uint)(1.0 / fVar185)),0);
            auVar291._0_4_ = auVar181._0_4_ * auVar194._0_4_;
            auVar291._4_4_ = auVar181._4_4_ * auVar194._4_4_;
            auVar291._8_4_ = auVar181._8_4_ * auVar194._8_4_;
            auVar291._12_4_ = auVar181._12_4_ * auVar194._12_4_;
            auVar296._0_4_ = auVar181._0_4_ * auVar96._0_4_;
            auVar296._4_4_ = auVar181._4_4_ * auVar96._4_4_;
            auVar296._8_4_ = auVar181._8_4_ * auVar96._8_4_;
            auVar296._12_4_ = auVar181._12_4_ * auVar96._12_4_;
            auVar132 = ZEXT416((uint)(1.0 / (auVar78._0_4_ - auVar261._0_4_)));
            auVar96 = vshufpd_avx(auVar99,auVar99,3);
            auVar194 = vshufpd_avx(auVar244,auVar244,3);
            auVar181 = vshufpd_avx(auVar273,auVar273,3);
            auVar143 = vshufpd_avx(auVar311,auVar311,3);
            auVar96 = vsubps_avx(auVar96,auVar99);
            auVar131 = vsubps_avx(auVar194,auVar244);
            auVar167 = vsubps_avx(auVar181,auVar273);
            auVar143 = vsubps_avx(auVar143,auVar311);
            auVar194 = vminps_avx(auVar96,auVar131);
            auVar96 = vmaxps_avx(auVar96,auVar131);
            auVar181 = vminps_avx(auVar167,auVar143);
            auVar181 = vminps_avx(auVar194,auVar181);
            auVar194 = vmaxps_avx(auVar167,auVar143);
            auVar96 = vmaxps_avx(auVar96,auVar194);
            auVar194 = vshufps_avx(auVar132,auVar132,0);
            auVar347._0_4_ = auVar194._0_4_ * auVar181._0_4_;
            auVar347._4_4_ = auVar194._4_4_ * auVar181._4_4_;
            auVar347._8_4_ = auVar194._8_4_ * auVar181._8_4_;
            auVar347._12_4_ = auVar194._12_4_ * auVar181._12_4_;
            auVar356._0_4_ = auVar194._0_4_ * auVar96._0_4_;
            auVar356._4_4_ = auVar194._4_4_ * auVar96._4_4_;
            auVar356._8_4_ = auVar194._8_4_ * auVar96._8_4_;
            auVar356._12_4_ = auVar194._12_4_ * auVar96._12_4_;
            auVar96 = vmovsldup_avx(auVar261);
            auVar312._4_12_ = auVar96._4_12_;
            auVar312._0_4_ = fVar186;
            auVar320._4_12_ = auVar261._4_12_;
            auVar320._0_4_ = fVar184;
            auVar198._0_4_ = (fVar186 + fVar184) * 0.5;
            auVar198._4_4_ = (auVar96._4_4_ + auVar261._4_4_) * 0.5;
            auVar198._8_4_ = (auVar96._8_4_ + auVar261._8_4_) * 0.5;
            auVar198._12_4_ = (auVar96._12_4_ + auVar261._12_4_) * 0.5;
            auVar96 = vshufps_avx(auVar198,auVar198,0);
            fVar201 = auVar96._0_4_;
            fVar202 = auVar96._4_4_;
            fVar203 = auVar96._8_4_;
            fVar204 = auVar96._12_4_;
            local_5d8._0_4_ = auVar18._0_4_;
            local_5d8._4_4_ = auVar18._4_4_;
            fStack_5d0 = auVar18._8_4_;
            fStack_5cc = auVar18._12_4_;
            auVar133._0_4_ = fVar201 * (float)local_258._0_4_ + (float)local_5d8._0_4_;
            auVar133._4_4_ = fVar202 * (float)local_258._4_4_ + (float)local_5d8._4_4_;
            auVar133._8_4_ = fVar203 * fStack_250 + fStack_5d0;
            auVar133._12_4_ = fVar204 * fStack_24c + fStack_5cc;
            local_5f8._0_4_ = auVar161._0_4_;
            local_5f8._4_4_ = auVar161._4_4_;
            fStack_5f0 = auVar161._8_4_;
            fStack_5ec = auVar161._12_4_;
            auVar171._0_4_ = fVar201 * (float)local_268._0_4_ + (float)local_5f8._0_4_;
            auVar171._4_4_ = fVar202 * (float)local_268._4_4_ + (float)local_5f8._4_4_;
            auVar171._8_4_ = fVar203 * fStack_260 + fStack_5f0;
            auVar171._12_4_ = fVar204 * fStack_25c + fStack_5ec;
            local_4f8 = auVar19._0_4_;
            fStack_4f4 = auVar19._4_4_;
            fStack_4f0 = auVar19._8_4_;
            fStack_4ec = auVar19._12_4_;
            auVar245._0_4_ = fVar201 * (float)local_278._0_4_ + local_4f8;
            auVar245._4_4_ = fVar202 * (float)local_278._4_4_ + fStack_4f4;
            auVar245._8_4_ = fVar203 * fStack_270 + fStack_4f0;
            auVar245._12_4_ = fVar204 * fStack_26c + fStack_4ec;
            auVar96 = vsubps_avx(auVar171,auVar133);
            auVar134._0_4_ = auVar133._0_4_ + fVar201 * auVar96._0_4_;
            auVar134._4_4_ = auVar133._4_4_ + fVar202 * auVar96._4_4_;
            auVar134._8_4_ = auVar133._8_4_ + fVar203 * auVar96._8_4_;
            auVar134._12_4_ = auVar133._12_4_ + fVar204 * auVar96._12_4_;
            auVar96 = vsubps_avx(auVar245,auVar171);
            auVar172._0_4_ = auVar171._0_4_ + fVar201 * auVar96._0_4_;
            auVar172._4_4_ = auVar171._4_4_ + fVar202 * auVar96._4_4_;
            auVar172._8_4_ = auVar171._8_4_ + fVar203 * auVar96._8_4_;
            auVar172._12_4_ = auVar171._12_4_ + fVar204 * auVar96._12_4_;
            auVar96 = vsubps_avx(auVar172,auVar134);
            fVar201 = auVar134._0_4_ + fVar201 * auVar96._0_4_;
            fVar202 = auVar134._4_4_ + fVar202 * auVar96._4_4_;
            auVar100._0_8_ = CONCAT44(fVar202,fVar201);
            auVar100._8_4_ = auVar134._8_4_ + fVar203 * auVar96._8_4_;
            auVar100._12_4_ = auVar134._12_4_ + fVar204 * auVar96._12_4_;
            fVar203 = auVar96._0_4_ * 3.0;
            fVar204 = auVar96._4_4_ * 3.0;
            auVar135._0_8_ = CONCAT44(fVar204,fVar203);
            auVar135._8_4_ = auVar96._8_4_ * 3.0;
            auVar135._12_4_ = auVar96._12_4_ * 3.0;
            auVar173._8_8_ = auVar100._0_8_;
            auVar173._0_8_ = auVar100._0_8_;
            auVar96 = vshufpd_avx(auVar100,auVar100,3);
            auVar194 = vshufps_avx(auVar198,auVar198,0x55);
            auVar167 = vsubps_avx(auVar96,auVar173);
            auVar335._0_4_ = auVar167._0_4_ * auVar194._0_4_ + fVar201;
            auVar335._4_4_ = auVar167._4_4_ * auVar194._4_4_ + fVar202;
            auVar335._8_4_ = auVar167._8_4_ * auVar194._8_4_ + fVar201;
            auVar335._12_4_ = auVar167._12_4_ * auVar194._12_4_ + fVar202;
            auVar174._8_8_ = auVar135._0_8_;
            auVar174._0_8_ = auVar135._0_8_;
            auVar96 = vshufpd_avx(auVar135,auVar135,1);
            auVar96 = vsubps_avx(auVar96,auVar174);
            auVar136._0_4_ = auVar96._0_4_ * auVar194._0_4_ + fVar203;
            auVar136._4_4_ = auVar96._4_4_ * auVar194._4_4_ + fVar204;
            auVar136._8_4_ = auVar96._8_4_ * auVar194._8_4_ + fVar203;
            auVar136._12_4_ = auVar96._12_4_ * auVar194._12_4_ + fVar204;
            auVar194 = vmovshdup_avx(auVar136);
            auVar246._0_8_ = auVar194._0_8_ ^ 0x8000000080000000;
            auVar246._8_4_ = auVar194._8_4_ ^ 0x80000000;
            auVar246._12_4_ = auVar194._12_4_ ^ 0x80000000;
            auVar181 = vmovshdup_avx(auVar167);
            auVar96 = vunpcklps_avx(auVar181,auVar246);
            auVar143 = vshufps_avx(auVar96,auVar246,4);
            auVar101._0_8_ = auVar167._0_8_ ^ 0x8000000080000000;
            auVar101._8_4_ = -auVar167._8_4_;
            auVar101._12_4_ = -auVar167._12_4_;
            auVar96 = vmovlhps_avx(auVar101,auVar136);
            auVar131 = vshufps_avx(auVar96,auVar136,8);
            auVar96 = ZEXT416((uint)(auVar136._0_4_ * auVar181._0_4_ -
                                    auVar167._0_4_ * auVar194._0_4_));
            auVar194 = vshufps_avx(auVar96,auVar96,0);
            auVar96 = vdivps_avx(auVar143,auVar194);
            auVar194 = vdivps_avx(auVar131,auVar194);
            auVar131 = vinsertps_avx(auVar291,auVar347,0x1c);
            auVar167 = vinsertps_avx(auVar296,auVar356,0x1c);
            auVar132 = vinsertps_avx(auVar347,auVar291,0x4c);
            auVar264 = vinsertps_avx(auVar356,auVar296,0x4c);
            auVar181 = vmovsldup_avx(auVar96);
            auVar175._0_4_ = auVar181._0_4_ * auVar131._0_4_;
            auVar175._4_4_ = auVar181._4_4_ * auVar131._4_4_;
            auVar175._8_4_ = auVar181._8_4_ * auVar131._8_4_;
            auVar175._12_4_ = auVar181._12_4_ * auVar131._12_4_;
            auVar137._0_4_ = auVar167._0_4_ * auVar181._0_4_;
            auVar137._4_4_ = auVar167._4_4_ * auVar181._4_4_;
            auVar137._8_4_ = auVar167._8_4_ * auVar181._8_4_;
            auVar137._12_4_ = auVar167._12_4_ * auVar181._12_4_;
            auVar143 = vminps_avx(auVar175,auVar137);
            auVar181 = vmaxps_avx(auVar137,auVar175);
            auVar77 = vmovsldup_avx(auVar194);
            auVar357._0_4_ = auVar132._0_4_ * auVar77._0_4_;
            auVar357._4_4_ = auVar132._4_4_ * auVar77._4_4_;
            auVar357._8_4_ = auVar132._8_4_ * auVar77._8_4_;
            auVar357._12_4_ = auVar132._12_4_ * auVar77._12_4_;
            auVar176._0_4_ = auVar264._0_4_ * auVar77._0_4_;
            auVar176._4_4_ = auVar264._4_4_ * auVar77._4_4_;
            auVar176._8_4_ = auVar264._8_4_ * auVar77._8_4_;
            auVar176._12_4_ = auVar264._12_4_ * auVar77._12_4_;
            auVar77 = vminps_avx(auVar357,auVar176);
            auVar221._0_4_ = auVar143._0_4_ + auVar77._0_4_;
            auVar221._4_4_ = auVar143._4_4_ + auVar77._4_4_;
            auVar221._8_4_ = auVar143._8_4_ + auVar77._8_4_;
            auVar221._12_4_ = auVar143._12_4_ + auVar77._12_4_;
            auVar143 = vmaxps_avx(auVar176,auVar357);
            auVar77 = vsubps_avx(auVar312,auVar198);
            auVar79 = vsubps_avx(auVar320,auVar198);
            auVar138._0_4_ = auVar181._0_4_ + auVar143._0_4_;
            auVar138._4_4_ = auVar181._4_4_ + auVar143._4_4_;
            auVar138._8_4_ = auVar181._8_4_ + auVar143._8_4_;
            auVar138._12_4_ = auVar181._12_4_ + auVar143._12_4_;
            auVar177._8_8_ = 0x3f800000;
            auVar177._0_8_ = 0x3f800000;
            auVar181 = vsubps_avx(auVar177,auVar138);
            auVar143 = vsubps_avx(auVar177,auVar221);
            fVar231 = auVar77._0_4_;
            auVar222._0_4_ = fVar231 * auVar181._0_4_;
            fVar117 = auVar77._4_4_;
            auVar222._4_4_ = fVar117 * auVar181._4_4_;
            fVar315 = auVar77._8_4_;
            auVar222._8_4_ = fVar315 * auVar181._8_4_;
            fVar325 = auVar77._12_4_;
            auVar222._12_4_ = fVar325 * auVar181._12_4_;
            fVar203 = auVar79._0_4_;
            auVar139._0_4_ = fVar203 * auVar181._0_4_;
            fVar204 = auVar79._4_4_;
            auVar139._4_4_ = fVar204 * auVar181._4_4_;
            fVar229 = auVar79._8_4_;
            auVar139._8_4_ = fVar229 * auVar181._8_4_;
            fVar230 = auVar79._12_4_;
            auVar139._12_4_ = fVar230 * auVar181._12_4_;
            auVar321._0_4_ = fVar231 * auVar143._0_4_;
            auVar321._4_4_ = fVar117 * auVar143._4_4_;
            auVar321._8_4_ = fVar315 * auVar143._8_4_;
            auVar321._12_4_ = fVar325 * auVar143._12_4_;
            auVar178._0_4_ = fVar203 * auVar143._0_4_;
            auVar178._4_4_ = fVar204 * auVar143._4_4_;
            auVar178._8_4_ = fVar229 * auVar143._8_4_;
            auVar178._12_4_ = fVar230 * auVar143._12_4_;
            auVar181 = vminps_avx(auVar222,auVar321);
            auVar143 = vminps_avx(auVar139,auVar178);
            auVar77 = vminps_avx(auVar181,auVar143);
            auVar181 = vmaxps_avx(auVar321,auVar222);
            auVar143 = vmaxps_avx(auVar178,auVar139);
            auVar79 = vshufps_avx(auVar198,auVar198,0x54);
            auVar143 = vmaxps_avx(auVar143,auVar181);
            auVar118 = vshufps_avx(auVar335,auVar335,0);
            auVar119 = vshufps_avx(auVar335,auVar335,0x55);
            auVar181 = vhaddps_avx(auVar77,auVar77);
            auVar143 = vhaddps_avx(auVar143,auVar143);
            auVar199._0_4_ = auVar118._0_4_ * auVar96._0_4_ + auVar119._0_4_ * auVar194._0_4_;
            auVar199._4_4_ = auVar118._4_4_ * auVar96._4_4_ + auVar119._4_4_ * auVar194._4_4_;
            auVar199._8_4_ = auVar118._8_4_ * auVar96._8_4_ + auVar119._8_4_ * auVar194._8_4_;
            auVar199._12_4_ = auVar118._12_4_ * auVar96._12_4_ + auVar119._12_4_ * auVar194._12_4_;
            auVar77 = vsubps_avx(auVar79,auVar199);
            fVar201 = auVar77._0_4_ + auVar181._0_4_;
            fVar202 = auVar77._0_4_ + auVar143._0_4_;
            auVar181 = vmaxss_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar201));
            auVar143 = vminss_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar184));
            if (auVar181._0_4_ <= auVar143._0_4_) {
              auVar181 = vmovshdup_avx(auVar96);
              auVar102._0_4_ = auVar181._0_4_ * auVar131._0_4_;
              auVar102._4_4_ = auVar181._4_4_ * auVar131._4_4_;
              auVar102._8_4_ = auVar181._8_4_ * auVar131._8_4_;
              auVar102._12_4_ = auVar181._12_4_ * auVar131._12_4_;
              auVar140._0_4_ = auVar167._0_4_ * auVar181._0_4_;
              auVar140._4_4_ = auVar167._4_4_ * auVar181._4_4_;
              auVar140._8_4_ = auVar167._8_4_ * auVar181._8_4_;
              auVar140._12_4_ = auVar167._12_4_ * auVar181._12_4_;
              auVar143 = vminps_avx(auVar102,auVar140);
              auVar181 = vmaxps_avx(auVar140,auVar102);
              auVar131 = vmovshdup_avx(auVar194);
              auVar223._0_4_ = auVar132._0_4_ * auVar131._0_4_;
              auVar223._4_4_ = auVar132._4_4_ * auVar131._4_4_;
              auVar223._8_4_ = auVar132._8_4_ * auVar131._8_4_;
              auVar223._12_4_ = auVar132._12_4_ * auVar131._12_4_;
              auVar141._0_4_ = auVar264._0_4_ * auVar131._0_4_;
              auVar141._4_4_ = auVar264._4_4_ * auVar131._4_4_;
              auVar141._8_4_ = auVar264._8_4_ * auVar131._8_4_;
              auVar141._12_4_ = auVar264._12_4_ * auVar131._12_4_;
              auVar131 = vminps_avx(auVar223,auVar141);
              auVar179._0_4_ = auVar143._0_4_ + auVar131._0_4_;
              auVar179._4_4_ = auVar143._4_4_ + auVar131._4_4_;
              auVar179._8_4_ = auVar143._8_4_ + auVar131._8_4_;
              auVar179._12_4_ = auVar143._12_4_ + auVar131._12_4_;
              auVar143 = vmaxps_avx(auVar141,auVar223);
              auVar103._0_4_ = auVar181._0_4_ + auVar143._0_4_;
              auVar103._4_4_ = auVar181._4_4_ + auVar143._4_4_;
              auVar103._8_4_ = auVar181._8_4_ + auVar143._8_4_;
              auVar103._12_4_ = auVar181._12_4_ + auVar143._12_4_;
              auVar181 = vsubps_avx(auVar259,auVar103);
              auVar143 = vsubps_avx(auVar259,auVar179);
              auVar180._0_4_ = fVar231 * auVar181._0_4_;
              auVar180._4_4_ = fVar117 * auVar181._4_4_;
              auVar180._8_4_ = fVar315 * auVar181._8_4_;
              auVar180._12_4_ = fVar325 * auVar181._12_4_;
              auVar224._0_4_ = fVar231 * auVar143._0_4_;
              auVar224._4_4_ = fVar117 * auVar143._4_4_;
              auVar224._8_4_ = fVar315 * auVar143._8_4_;
              auVar224._12_4_ = fVar325 * auVar143._12_4_;
              auVar104._0_4_ = fVar203 * auVar181._0_4_;
              auVar104._4_4_ = fVar204 * auVar181._4_4_;
              auVar104._8_4_ = fVar229 * auVar181._8_4_;
              auVar104._12_4_ = fVar230 * auVar181._12_4_;
              auVar142._0_4_ = fVar203 * auVar143._0_4_;
              auVar142._4_4_ = fVar204 * auVar143._4_4_;
              auVar142._8_4_ = fVar229 * auVar143._8_4_;
              auVar142._12_4_ = fVar230 * auVar143._12_4_;
              auVar181 = vminps_avx(auVar180,auVar224);
              auVar143 = vminps_avx(auVar104,auVar142);
              auVar181 = vminps_avx(auVar181,auVar143);
              auVar143 = vmaxps_avx(auVar224,auVar180);
              auVar131 = vmaxps_avx(auVar142,auVar104);
              auVar181 = vhaddps_avx(auVar181,auVar181);
              auVar143 = vmaxps_avx(auVar131,auVar143);
              auVar143 = vhaddps_avx(auVar143,auVar143);
              auVar131 = vmovshdup_avx(auVar77);
              auVar167 = ZEXT416((uint)(auVar131._0_4_ + auVar181._0_4_));
              auVar181 = vmaxss_avx(auVar261,auVar167);
              auVar131 = ZEXT416((uint)(auVar131._0_4_ + auVar143._0_4_));
              auVar143 = vminss_avx(auVar131,auVar78);
              if (auVar181._0_4_ <= auVar143._0_4_) {
                bVar71 = 0;
                if ((fVar186 < fVar201) && (fVar202 < fVar184)) {
                  auVar181 = vcmpps_avx(auVar131,auVar78,1);
                  auVar143 = vcmpps_avx(auVar261,auVar167,1);
                  auVar181 = vandps_avx(auVar143,auVar181);
                  bVar71 = auVar181[0];
                }
                auVar324 = ZEXT1664(auVar261);
                if ((uVar74 < 4 && 0.001 <= fVar185) && (bVar71 & 1) == 0) goto LAB_00f277ae;
                lVar69 = 200;
                do {
                  fVar185 = auVar77._0_4_;
                  fVar184 = 1.0 - fVar185;
                  auVar181 = ZEXT416((uint)(fVar184 * fVar184 * fVar184));
                  auVar181 = vshufps_avx(auVar181,auVar181,0);
                  auVar143 = ZEXT416((uint)(fVar185 * 3.0 * fVar184 * fVar184));
                  auVar143 = vshufps_avx(auVar143,auVar143,0);
                  auVar131 = ZEXT416((uint)(fVar184 * fVar185 * fVar185 * 3.0));
                  auVar131 = vshufps_avx(auVar131,auVar131,0);
                  auVar167 = ZEXT416((uint)(fVar185 * fVar185 * fVar185));
                  auVar167 = vshufps_avx(auVar167,auVar167,0);
                  local_458._0_4_ = auVar20._0_4_;
                  local_458._4_4_ = auVar20._4_4_;
                  fStack_450 = auVar20._8_4_;
                  fStack_44c = auVar20._12_4_;
                  fVar184 = auVar181._0_4_ * (float)local_5d8._0_4_ +
                            auVar143._0_4_ * (float)local_5f8._0_4_ +
                            auVar167._0_4_ * (float)local_458._0_4_ + auVar131._0_4_ * local_4f8;
                  fVar185 = auVar181._4_4_ * (float)local_5d8._4_4_ +
                            auVar143._4_4_ * (float)local_5f8._4_4_ +
                            auVar167._4_4_ * (float)local_458._4_4_ + auVar131._4_4_ * fStack_4f4;
                  auVar105._0_8_ = CONCAT44(fVar185,fVar184);
                  auVar105._8_4_ =
                       auVar181._8_4_ * fStack_5d0 +
                       auVar143._8_4_ * fStack_5f0 +
                       auVar167._8_4_ * fStack_450 + auVar131._8_4_ * fStack_4f0;
                  auVar105._12_4_ =
                       auVar181._12_4_ * fStack_5cc +
                       auVar143._12_4_ * fStack_5ec +
                       auVar167._12_4_ * fStack_44c + auVar131._12_4_ * fStack_4ec;
                  auVar144._8_8_ = auVar105._0_8_;
                  auVar144._0_8_ = auVar105._0_8_;
                  auVar143 = vshufpd_avx(auVar105,auVar105,1);
                  auVar181 = vmovshdup_avx(auVar77);
                  auVar143 = vsubps_avx(auVar143,auVar144);
                  auVar106._0_4_ = auVar181._0_4_ * auVar143._0_4_ + fVar184;
                  auVar106._4_4_ = auVar181._4_4_ * auVar143._4_4_ + fVar185;
                  auVar106._8_4_ = auVar181._8_4_ * auVar143._8_4_ + fVar184;
                  auVar106._12_4_ = auVar181._12_4_ * auVar143._12_4_ + fVar185;
                  auVar181 = vshufps_avx(auVar106,auVar106,0);
                  auVar143 = vshufps_avx(auVar106,auVar106,0x55);
                  auVar145._0_4_ = auVar96._0_4_ * auVar181._0_4_ + auVar194._0_4_ * auVar143._0_4_;
                  auVar145._4_4_ = auVar96._4_4_ * auVar181._4_4_ + auVar194._4_4_ * auVar143._4_4_;
                  auVar145._8_4_ = auVar96._8_4_ * auVar181._8_4_ + auVar194._8_4_ * auVar143._8_4_;
                  auVar145._12_4_ =
                       auVar96._12_4_ * auVar181._12_4_ + auVar194._12_4_ * auVar143._12_4_;
                  auVar77 = vsubps_avx(auVar77,auVar145);
                  auVar146._8_4_ = 0x7fffffff;
                  auVar146._0_8_ = 0x7fffffff7fffffff;
                  auVar146._12_4_ = 0x7fffffff;
                  auVar181 = vandps_avx(auVar106,auVar146);
                  auVar143 = vshufps_avx(auVar181,auVar181,0xf5);
                  auVar181 = vmaxss_avx(auVar143,auVar181);
                  if (auVar181._0_4_ < fVar151) {
                    fVar184 = auVar77._0_4_;
                    if ((0.0 <= fVar184) && (fVar184 <= 1.0)) {
                      auVar96 = vmovshdup_avx(auVar77);
                      fVar185 = auVar96._0_4_;
                      if ((0.0 <= fVar185) && (fVar185 <= 1.0)) {
                        auVar96 = vinsertps_avx(ZEXT416((uint)(pLVar65->vx).field_0.m128[2]),
                                                ZEXT416((uint)(pLVar65->vy).field_0.m128[2]),0x1c);
                        auVar264 = vinsertps_avx(auVar96,ZEXT416((uint)(pLVar65->vz).field_0.m128[2]
                                                                ),0x28);
                        auVar96 = vdpps_avx(auVar264,local_288,0x7f);
                        auVar194 = vdpps_avx(auVar264,local_298,0x7f);
                        auVar181 = vdpps_avx(auVar264,local_2a8,0x7f);
                        auVar143 = vdpps_avx(auVar264,local_2b8,0x7f);
                        auVar131 = vdpps_avx(auVar264,local_2c8,0x7f);
                        auVar167 = vdpps_avx(auVar264,local_2d8,0x7f);
                        auVar132 = vdpps_avx(auVar264,local_2e8,0x7f);
                        auVar264 = vdpps_avx(auVar264,local_2f8,0x7f);
                        fVar204 = 1.0 - fVar185;
                        fVar229 = 1.0 - fVar184;
                        fVar186 = auVar77._4_4_;
                        fVar201 = auVar77._8_4_;
                        fVar202 = auVar77._12_4_;
                        fVar203 = fVar229 * fVar184 * fVar184 * 3.0;
                        auVar274._0_4_ = fVar184 * fVar184 * fVar184;
                        auVar274._4_4_ = fVar186 * fVar186 * fVar186;
                        auVar274._8_4_ = fVar201 * fVar201 * fVar201;
                        auVar274._12_4_ = fVar202 * fVar202 * fVar202;
                        fVar201 = fVar229 * fVar229 * fVar184 * 3.0;
                        fVar202 = fVar229 * fVar229 * fVar229;
                        fVar186 = fVar202 * (fVar204 * auVar96._0_4_ + fVar185 * auVar131._0_4_) +
                                  (fVar204 * auVar194._0_4_ + auVar167._0_4_ * fVar185) * fVar201 +
                                  fVar203 * (auVar132._0_4_ * fVar185 + fVar204 * auVar181._0_4_) +
                                  auVar274._0_4_ *
                                  (fVar204 * auVar143._0_4_ + fVar185 * auVar264._0_4_);
                        auVar96 = ZEXT416((uint)fVar186);
                        if (((fVar76 <= fVar186) &&
                            (fVar204 = *(float *)(ray + k * 4 + 0x80), fVar186 <= fVar204)) &&
                           (pGVar12 = (context->scene->geometries).items[uVar67].ptr,
                           (pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                          local_1a8 = vshufps_avx(auVar77,auVar77,0x55);
                          auVar297._8_4_ = 0x3f800000;
                          auVar297._0_8_ = 0x3f8000003f800000;
                          auVar297._12_4_ = 0x3f800000;
                          auVar194 = vsubps_avx(auVar297,local_1a8);
                          fVar230 = local_1a8._0_4_;
                          fVar231 = local_1a8._4_4_;
                          fVar117 = local_1a8._8_4_;
                          fVar315 = local_1a8._12_4_;
                          fVar325 = auVar194._0_4_;
                          fVar327 = auVar194._4_4_;
                          fVar329 = auVar194._8_4_;
                          fVar331 = auVar194._12_4_;
                          auVar313._0_4_ =
                               fVar230 * (float)local_3d8._0_4_ + fVar325 * (float)local_3a8._0_4_;
                          auVar313._4_4_ =
                               fVar231 * (float)local_3d8._4_4_ + fVar327 * (float)local_3a8._4_4_;
                          auVar313._8_4_ = fVar117 * fStack_3d0 + fVar329 * fStack_3a0;
                          auVar313._12_4_ = fVar315 * fStack_3cc + fVar331 * fStack_39c;
                          auVar322._0_4_ = fVar230 * (float)local_3e8._0_4_ + fVar325 * fVar293;
                          auVar322._4_4_ = fVar231 * (float)local_3e8._4_4_ + fVar327 * fVar301;
                          auVar322._8_4_ = fVar117 * fStack_3e0 + fVar329 * fVar302;
                          auVar322._12_4_ = fVar315 * fStack_3dc + fVar331 * fVar303;
                          auVar336._0_4_ =
                               fVar230 * (float)local_318._0_4_ + fVar325 * (float)local_3b8._0_4_;
                          auVar336._4_4_ =
                               fVar231 * (float)local_318._4_4_ + fVar327 * (float)local_3b8._4_4_;
                          auVar336._8_4_ = fVar117 * fStack_310 + fVar329 * fStack_3b0;
                          auVar336._12_4_ = fVar315 * fStack_30c + fVar331 * fStack_3ac;
                          auVar298._0_4_ = fVar230 * fVar233 + fVar325 * (float)local_3c8._0_4_;
                          auVar298._4_4_ = fVar231 * fVar252 + fVar327 * (float)local_3c8._4_4_;
                          auVar298._8_4_ = fVar117 * fVar115 + fVar329 * fStack_3c0;
                          auVar298._12_4_ = fVar315 * fVar116 + fVar331 * fStack_3bc;
                          auVar131 = vsubps_avx(auVar322,auVar313);
                          auVar167 = vsubps_avx(auVar336,auVar322);
                          auVar132 = vsubps_avx(auVar298,auVar336);
                          local_1b8 = vshufps_avx(auVar77,auVar77,0);
                          fVar315 = local_1b8._0_4_;
                          fVar325 = local_1b8._4_4_;
                          fVar327 = local_1b8._8_4_;
                          fVar329 = local_1b8._12_4_;
                          auVar194 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
                          fVar229 = auVar194._0_4_;
                          fVar230 = auVar194._4_4_;
                          fVar231 = auVar194._8_4_;
                          fVar117 = auVar194._12_4_;
                          auVar194 = vshufps_avx(auVar274,auVar274,0);
                          auVar181 = vshufps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),0);
                          auVar143 = vshufps_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),0);
                          auVar262._0_4_ =
                               (fVar229 * (fVar229 * auVar131._0_4_ + fVar315 * auVar167._0_4_) +
                               fVar315 * (fVar229 * auVar167._0_4_ + fVar315 * auVar132._0_4_)) *
                               3.0;
                          auVar262._4_4_ =
                               (fVar230 * (fVar230 * auVar131._4_4_ + fVar325 * auVar167._4_4_) +
                               fVar325 * (fVar230 * auVar167._4_4_ + fVar325 * auVar132._4_4_)) *
                               3.0;
                          auVar262._8_4_ =
                               (fVar231 * (fVar231 * auVar131._8_4_ + fVar327 * auVar167._8_4_) +
                               fVar327 * (fVar231 * auVar167._8_4_ + fVar327 * auVar132._8_4_)) *
                               3.0;
                          auVar262._12_4_ =
                               (fVar117 * (fVar117 * auVar131._12_4_ + fVar329 * auVar167._12_4_) +
                               fVar329 * (fVar117 * auVar167._12_4_ + fVar329 * auVar132._12_4_)) *
                               3.0;
                          auVar131 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
                          auVar225._0_4_ =
                               auVar131._0_4_ * (float)local_328._0_4_ +
                               auVar143._0_4_ * (float)local_338._0_4_ +
                               auVar194._0_4_ * (float)local_358._0_4_ +
                               auVar181._0_4_ * (float)local_348._0_4_;
                          auVar225._4_4_ =
                               auVar131._4_4_ * (float)local_328._4_4_ +
                               auVar143._4_4_ * (float)local_338._4_4_ +
                               auVar194._4_4_ * (float)local_358._4_4_ +
                               auVar181._4_4_ * (float)local_348._4_4_;
                          auVar225._8_4_ =
                               auVar131._8_4_ * fStack_320 +
                               auVar143._8_4_ * fStack_330 +
                               auVar194._8_4_ * fStack_350 + auVar181._8_4_ * fStack_340;
                          auVar225._12_4_ =
                               auVar131._12_4_ * fStack_31c +
                               auVar143._12_4_ * fStack_32c +
                               auVar194._12_4_ * fStack_34c + auVar181._12_4_ * fStack_33c;
                          auVar194 = vshufps_avx(auVar262,auVar262,0xc9);
                          auVar247._0_4_ = auVar225._0_4_ * auVar194._0_4_;
                          auVar247._4_4_ = auVar225._4_4_ * auVar194._4_4_;
                          auVar247._8_4_ = auVar225._8_4_ * auVar194._8_4_;
                          auVar247._12_4_ = auVar225._12_4_ * auVar194._12_4_;
                          auVar194 = vshufps_avx(auVar225,auVar225,0xc9);
                          auVar226._0_4_ = auVar262._0_4_ * auVar194._0_4_;
                          auVar226._4_4_ = auVar262._4_4_ * auVar194._4_4_;
                          auVar226._8_4_ = auVar262._8_4_ * auVar194._8_4_;
                          auVar226._12_4_ = auVar262._12_4_ * auVar194._12_4_;
                          auVar194 = vsubps_avx(auVar226,auVar247);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar186;
                            uVar8 = vextractps_avx(auVar194,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                            uVar8 = vextractps_avx(auVar194,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                            *(int *)(ray + k * 4 + 0xe0) = auVar194._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar184;
                            *(float *)(ray + k * 4 + 0x100) = fVar185;
                            *(uint *)(ray + k * 4 + 0x110) = uVar11;
                            *(uint *)(ray + k * 4 + 0x120) = uVar67;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            auVar181 = vshufps_avx(auVar194,auVar194,0x55);
                            auVar143 = vshufps_avx(auVar194,auVar194,0xaa);
                            local_1c8 = vshufps_avx(auVar194,auVar194,0);
                            local_1e8[0] = (RTCHitN)auVar181[0];
                            local_1e8[1] = (RTCHitN)auVar181[1];
                            local_1e8[2] = (RTCHitN)auVar181[2];
                            local_1e8[3] = (RTCHitN)auVar181[3];
                            local_1e8[4] = (RTCHitN)auVar181[4];
                            local_1e8[5] = (RTCHitN)auVar181[5];
                            local_1e8[6] = (RTCHitN)auVar181[6];
                            local_1e8[7] = (RTCHitN)auVar181[7];
                            local_1e8[8] = (RTCHitN)auVar181[8];
                            local_1e8[9] = (RTCHitN)auVar181[9];
                            local_1e8[10] = (RTCHitN)auVar181[10];
                            local_1e8[0xb] = (RTCHitN)auVar181[0xb];
                            local_1e8[0xc] = (RTCHitN)auVar181[0xc];
                            local_1e8[0xd] = (RTCHitN)auVar181[0xd];
                            local_1e8[0xe] = (RTCHitN)auVar181[0xe];
                            local_1e8[0xf] = (RTCHitN)auVar181[0xf];
                            local_1d8 = auVar143;
                            local_198 = local_388._0_8_;
                            uStack_190 = local_388._8_8_;
                            local_188 = local_378._0_8_;
                            uStack_180 = local_378._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_174 = context->user->instID[0];
                            local_178 = uStack_174;
                            uStack_170 = uStack_174;
                            uStack_16c = uStack_174;
                            uStack_168 = context->user->instPrimID[0];
                            uStack_164 = uStack_168;
                            uStack_160 = uStack_168;
                            uStack_15c = uStack_168;
                            *(float *)(ray + k * 4 + 0x80) = fVar186;
                            local_448 = *local_430;
                            local_418.valid = (int *)local_448;
                            local_418.geometryUserPtr = pGVar12->userPtr;
                            local_418.context = context->user;
                            local_418.hit = local_1e8;
                            local_418.N = 4;
                            local_418.ray = (RTCRayN *)ray;
                            if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar12->intersectionFilterN)(&local_418);
                              auVar324._8_56_ = extraout_var;
                              auVar324._0_8_ = extraout_XMM1_Qa;
                              auVar96 = auVar324._0_16_;
                            }
                            if (local_448 == (undefined1  [16])0x0) {
                              auVar194 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar96 = vpcmpeqd_avx(auVar96,auVar96);
                              auVar194 = auVar194 ^ auVar96;
                            }
                            else {
                              p_Var17 = context->args->filter;
                              auVar96 = vpcmpeqd_avx(auVar143,auVar143);
                              if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var17)(&local_418);
                                auVar96 = vpcmpeqd_avx(auVar96,auVar96);
                              }
                              auVar181 = vpcmpeqd_avx(local_448,_DAT_01f7aa10);
                              auVar194 = auVar181 ^ auVar96;
                              if (local_448 != (undefined1  [16])0x0) {
                                auVar181 = auVar181 ^ auVar96;
                                auVar96 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                   local_418.hit);
                                *(undefined1 (*) [16])(local_418.ray + 0xc0) = auVar96;
                                auVar96 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x10));
                                *(undefined1 (*) [16])(local_418.ray + 0xd0) = auVar96;
                                auVar96 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x20));
                                *(undefined1 (*) [16])(local_418.ray + 0xe0) = auVar96;
                                auVar96 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x30));
                                *(undefined1 (*) [16])(local_418.ray + 0xf0) = auVar96;
                                auVar96 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x40));
                                *(undefined1 (*) [16])(local_418.ray + 0x100) = auVar96;
                                auVar96 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x50));
                                *(undefined1 (*) [16])(local_418.ray + 0x110) = auVar96;
                                auVar96 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x60));
                                *(undefined1 (*) [16])(local_418.ray + 0x120) = auVar96;
                                auVar96 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x70));
                                *(undefined1 (*) [16])(local_418.ray + 0x130) = auVar96;
                                auVar96 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])
                                                                   (local_418.hit + 0x80));
                                *(undefined1 (*) [16])(local_418.ray + 0x140) = auVar96;
                              }
                            }
                            auVar107._8_8_ = 0x100000001;
                            auVar107._0_8_ = 0x100000001;
                            if ((auVar107 & auVar194) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar204;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar69 = lVar69 + -1;
                } while (lVar69 != 0);
              }
            }
          }
        }
        if (uVar74 == 0) break;
      } while( true );
    }
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar108._4_4_ = uVar8;
    auVar108._0_4_ = uVar8;
    auVar108._8_4_ = uVar8;
    auVar108._12_4_ = uVar8;
    auVar96 = vcmpps_avx(local_368,auVar108,2);
    uVar67 = vmovmskps_avx(auVar96);
    uVar66 = uVar66 & uVar66 + 0xf & uVar67;
    auVar58 = ZEXT812(0) << 0x20;
    if (uVar66 == 0) {
      return;
    }
  } while( true );
LAB_00f277ae:
  auVar96 = vinsertps_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar184),0x10);
  auVar362 = ZEXT1664(auVar96);
  goto LAB_00f2604b;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }